

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCRayQueryContext *pRVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [12];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  byte bVar79;
  byte bVar80;
  uint uVar81;
  ulong uVar82;
  byte bVar83;
  byte bVar84;
  int iVar85;
  long lVar86;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  byte bVar87;
  long lVar88;
  ulong uVar89;
  uint uVar90;
  uint uVar91;
  uint uVar153;
  uint uVar154;
  uint uVar156;
  uint uVar157;
  uint uVar158;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  uint uVar155;
  uint uVar159;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float pp;
  float fVar160;
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar178;
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar169 [32];
  float fVar180;
  float fVar184;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar196 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  float fVar202;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar223;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar250;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar248;
  float fVar249;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar255;
  undefined1 auVar254 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar261 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [64];
  float fVar263;
  float fVar270;
  undefined1 auVar266 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar268;
  float fVar269;
  undefined1 auVar267 [64];
  undefined1 auVar271 [64];
  float fVar273;
  undefined1 auVar272 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [32];
  undefined1 auVar288 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 (*local_850) [32];
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  Primitive *local_6b0;
  ulong local_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  RTCHitN local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar279 [64];
  
  PVar3 = prim[1];
  uVar89 = (ulong)(byte)PVar3;
  lVar88 = uVar89 * 0x25;
  fVar263 = *(float *)(prim + lVar88 + 0x12);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar97 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar98 = vsubps_avx(auVar92,*(undefined1 (*) [16])(prim + lVar88 + 6));
  fVar223 = fVar263 * auVar98._0_4_;
  fVar160 = fVar263 * auVar97._0_4_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar89 * 4 + 6);
  auVar109 = vpmovsxbd_avx2(auVar92);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar89 * 5 + 6);
  auVar108 = vpmovsxbd_avx2(auVar19);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar89 * 6 + 6);
  auVar110 = vpmovsxbd_avx2(auVar94);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar89 * 0xf + 6);
  auVar111 = vpmovsxbd_avx2(auVar100);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar117 = vpmovsxbd_avx2(auVar2);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar112 = vcvtdq2ps_avx(auVar117);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar89 + 6);
  auVar113 = vpmovsxbd_avx2(auVar95);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar89 * 0x1a + 6);
  auVar114 = vpmovsxbd_avx2(auVar101);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar89 * 0x1b + 6);
  auVar115 = vpmovsxbd_avx2(auVar93);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar89 * 0x1c + 6);
  auVar107 = vpmovsxbd_avx2(auVar96);
  auVar116 = vcvtdq2ps_avx(auVar107);
  auVar124._4_4_ = fVar160;
  auVar124._0_4_ = fVar160;
  auVar124._8_4_ = fVar160;
  auVar124._12_4_ = fVar160;
  auVar124._16_4_ = fVar160;
  auVar124._20_4_ = fVar160;
  auVar124._24_4_ = fVar160;
  auVar124._28_4_ = fVar160;
  auVar130._8_4_ = 1;
  auVar130._0_8_ = 0x100000001;
  auVar130._12_4_ = 1;
  auVar130._16_4_ = 1;
  auVar130._20_4_ = 1;
  auVar130._24_4_ = 1;
  auVar130._28_4_ = 1;
  auVar105 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar119 = ZEXT1632(CONCAT412(fVar263 * auVar97._12_4_,
                                CONCAT48(fVar263 * auVar97._8_4_,
                                         CONCAT44(fVar263 * auVar97._4_4_,fVar160))));
  auVar118 = vpermps_avx2(auVar130,auVar119);
  auVar106 = vpermps_avx512vl(auVar105,auVar119);
  fVar268 = auVar106._0_4_;
  fVar269 = auVar106._4_4_;
  auVar119._4_4_ = fVar269 * auVar110._4_4_;
  auVar119._0_4_ = fVar268 * auVar110._0_4_;
  fVar270 = auVar106._8_4_;
  auVar119._8_4_ = fVar270 * auVar110._8_4_;
  fVar239 = auVar106._12_4_;
  auVar119._12_4_ = fVar239 * auVar110._12_4_;
  fVar240 = auVar106._16_4_;
  auVar119._16_4_ = fVar240 * auVar110._16_4_;
  fVar241 = auVar106._20_4_;
  auVar119._20_4_ = fVar241 * auVar110._20_4_;
  fVar183 = auVar106._24_4_;
  auVar119._24_4_ = fVar183 * auVar110._24_4_;
  auVar119._28_4_ = auVar117._28_4_;
  auVar117._4_4_ = auVar113._4_4_ * fVar269;
  auVar117._0_4_ = auVar113._0_4_ * fVar268;
  auVar117._8_4_ = auVar113._8_4_ * fVar270;
  auVar117._12_4_ = auVar113._12_4_ * fVar239;
  auVar117._16_4_ = auVar113._16_4_ * fVar240;
  auVar117._20_4_ = auVar113._20_4_ * fVar241;
  auVar117._24_4_ = auVar113._24_4_ * fVar183;
  auVar117._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar116._4_4_ * fVar269;
  auVar107._0_4_ = auVar116._0_4_ * fVar268;
  auVar107._8_4_ = auVar116._8_4_ * fVar270;
  auVar107._12_4_ = auVar116._12_4_ * fVar239;
  auVar107._16_4_ = auVar116._16_4_ * fVar240;
  auVar107._20_4_ = auVar116._20_4_ * fVar241;
  auVar107._24_4_ = auVar116._24_4_ * fVar183;
  auVar107._28_4_ = auVar106._28_4_;
  auVar92 = vfmadd231ps_fma(auVar119,auVar118,auVar108);
  auVar19 = vfmadd231ps_fma(auVar117,auVar118,auVar112);
  auVar94 = vfmadd231ps_fma(auVar107,auVar115,auVar118);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar124,auVar109);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar124,auVar111);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar114,auVar124);
  auVar129._4_4_ = fVar223;
  auVar129._0_4_ = fVar223;
  auVar129._8_4_ = fVar223;
  auVar129._12_4_ = fVar223;
  auVar129._16_4_ = fVar223;
  auVar129._20_4_ = fVar223;
  auVar129._24_4_ = fVar223;
  auVar129._28_4_ = fVar223;
  auVar107 = ZEXT1632(CONCAT412(fVar263 * auVar98._12_4_,
                                CONCAT48(fVar263 * auVar98._8_4_,
                                         CONCAT44(fVar263 * auVar98._4_4_,fVar223))));
  auVar117 = vpermps_avx2(auVar130,auVar107);
  auVar107 = vpermps_avx512vl(auVar105,auVar107);
  fVar263 = auVar107._0_4_;
  fVar268 = auVar107._4_4_;
  auVar118._4_4_ = fVar268 * auVar110._4_4_;
  auVar118._0_4_ = fVar263 * auVar110._0_4_;
  fVar269 = auVar107._8_4_;
  auVar118._8_4_ = fVar269 * auVar110._8_4_;
  fVar270 = auVar107._12_4_;
  auVar118._12_4_ = fVar270 * auVar110._12_4_;
  fVar239 = auVar107._16_4_;
  auVar118._16_4_ = fVar239 * auVar110._16_4_;
  fVar240 = auVar107._20_4_;
  auVar118._20_4_ = fVar240 * auVar110._20_4_;
  fVar241 = auVar107._24_4_;
  auVar118._24_4_ = fVar241 * auVar110._24_4_;
  auVar118._28_4_ = fVar160;
  auVar105._4_4_ = auVar113._4_4_ * fVar268;
  auVar105._0_4_ = auVar113._0_4_ * fVar263;
  auVar105._8_4_ = auVar113._8_4_ * fVar269;
  auVar105._12_4_ = auVar113._12_4_ * fVar270;
  auVar105._16_4_ = auVar113._16_4_ * fVar239;
  auVar105._20_4_ = auVar113._20_4_ * fVar240;
  auVar105._24_4_ = auVar113._24_4_ * fVar241;
  auVar105._28_4_ = auVar110._28_4_;
  auVar113._4_4_ = auVar116._4_4_ * fVar268;
  auVar113._0_4_ = auVar116._0_4_ * fVar263;
  auVar113._8_4_ = auVar116._8_4_ * fVar269;
  auVar113._12_4_ = auVar116._12_4_ * fVar270;
  auVar113._16_4_ = auVar116._16_4_ * fVar239;
  auVar113._20_4_ = auVar116._20_4_ * fVar240;
  auVar113._24_4_ = auVar116._24_4_ * fVar241;
  auVar113._28_4_ = auVar107._28_4_;
  auVar100 = vfmadd231ps_fma(auVar118,auVar117,auVar108);
  auVar2 = vfmadd231ps_fma(auVar105,auVar117,auVar112);
  auVar95 = vfmadd231ps_fma(auVar113,auVar117,auVar115);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar129,auVar109);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar129,auVar111);
  auVar126._8_4_ = 0x7fffffff;
  auVar126._0_8_ = 0x7fffffff7fffffff;
  auVar126._12_4_ = 0x7fffffff;
  auVar126._16_4_ = 0x7fffffff;
  auVar126._20_4_ = 0x7fffffff;
  auVar126._24_4_ = 0x7fffffff;
  auVar126._28_4_ = 0x7fffffff;
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar129,auVar114);
  auVar109 = vandps_avx(ZEXT1632(auVar92),auVar126);
  auVar128._8_4_ = 0x219392ef;
  auVar128._0_8_ = 0x219392ef219392ef;
  auVar128._12_4_ = 0x219392ef;
  auVar128._16_4_ = 0x219392ef;
  auVar128._20_4_ = 0x219392ef;
  auVar128._24_4_ = 0x219392ef;
  auVar128._28_4_ = 0x219392ef;
  uVar82 = vcmpps_avx512vl(auVar109,auVar128,1);
  bVar11 = (bool)((byte)uVar82 & 1);
  auVar106._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar92._0_4_;
  bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar92._4_4_;
  bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar92._8_4_;
  bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar92._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar19),auVar126);
  uVar82 = vcmpps_avx512vl(auVar109,auVar128,1);
  bVar11 = (bool)((byte)uVar82 & 1);
  auVar120._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar19._0_4_;
  bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar120._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar19._4_4_;
  bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar120._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar19._8_4_;
  bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar120._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar19._12_4_;
  auVar120._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar120._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar120._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar120._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar94),auVar126);
  uVar82 = vcmpps_avx512vl(auVar109,auVar128,1);
  bVar11 = (bool)((byte)uVar82 & 1);
  auVar109._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar94._0_4_;
  bVar11 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar94._4_4_;
  bVar11 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar94._8_4_;
  bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar94._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar108 = vrcp14ps_avx512vl(auVar106);
  auVar127._8_4_ = 0x3f800000;
  auVar127._0_8_ = 0x3f8000003f800000;
  auVar127._12_4_ = 0x3f800000;
  auVar127._16_4_ = 0x3f800000;
  auVar127._20_4_ = 0x3f800000;
  auVar127._24_4_ = 0x3f800000;
  auVar127._28_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar106,auVar108,auVar127);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar108,auVar108);
  auVar108 = vrcp14ps_avx512vl(auVar120);
  auVar19 = vfnmadd213ps_fma(auVar120,auVar108,auVar127);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar108,auVar108);
  auVar108 = vrcp14ps_avx512vl(auVar109);
  auVar94 = vfnmadd213ps_fma(auVar109,auVar108,auVar127);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar108,auVar108);
  fVar263 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar88 + 0x16)) *
            *(float *)(prim + lVar88 + 0x1a);
  auVar125._4_4_ = fVar263;
  auVar125._0_4_ = fVar263;
  auVar125._8_4_ = fVar263;
  auVar125._12_4_ = fVar263;
  auVar125._16_4_ = fVar263;
  auVar125._20_4_ = fVar263;
  auVar125._24_4_ = fVar263;
  auVar125._28_4_ = fVar263;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 7 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0xb + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,auVar109);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 9 + 6));
  auVar100 = vfmadd213ps_fma(auVar108,auVar125,auVar109);
  auVar109 = vcvtdq2ps_avx(auVar110);
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0xd + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,auVar109);
  auVar2 = vfmadd213ps_fma(auVar108,auVar125,auVar109);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x12 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  uVar82 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 2 + uVar82 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,auVar109);
  auVar95 = vfmadd213ps_fma(auVar108,auVar125,auVar109);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x18 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,auVar109);
  auVar101 = vfmadd213ps_fma(auVar108,auVar125,auVar109);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x1d + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 + (ulong)(byte)PVar3 * 0x20 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,auVar109);
  auVar93 = vfmadd213ps_fma(auVar108,auVar125,auVar109);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar3 * 0x20 - uVar89) + 6))
  ;
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x23 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,auVar109);
  auVar96 = vfmadd213ps_fma(auVar108,auVar125,auVar109);
  auVar109 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar97));
  auVar114._4_4_ = auVar92._4_4_ * auVar109._4_4_;
  auVar114._0_4_ = auVar92._0_4_ * auVar109._0_4_;
  auVar114._8_4_ = auVar92._8_4_ * auVar109._8_4_;
  auVar114._12_4_ = auVar92._12_4_ * auVar109._12_4_;
  auVar114._16_4_ = auVar109._16_4_ * 0.0;
  auVar114._20_4_ = auVar109._20_4_ * 0.0;
  auVar114._24_4_ = auVar109._24_4_ * 0.0;
  auVar114._28_4_ = auVar109._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar2),ZEXT1632(auVar97));
  auVar123._0_4_ = auVar92._0_4_ * auVar109._0_4_;
  auVar123._4_4_ = auVar92._4_4_ * auVar109._4_4_;
  auVar123._8_4_ = auVar92._8_4_ * auVar109._8_4_;
  auVar123._12_4_ = auVar92._12_4_ * auVar109._12_4_;
  auVar123._16_4_ = auVar109._16_4_ * 0.0;
  auVar123._20_4_ = auVar109._20_4_ * 0.0;
  auVar123._24_4_ = auVar109._24_4_ * 0.0;
  auVar123._28_4_ = 0;
  auVar109 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar98));
  auVar115._4_4_ = auVar19._4_4_ * auVar109._4_4_;
  auVar115._0_4_ = auVar19._0_4_ * auVar109._0_4_;
  auVar115._8_4_ = auVar19._8_4_ * auVar109._8_4_;
  auVar115._12_4_ = auVar19._12_4_ * auVar109._12_4_;
  auVar115._16_4_ = auVar109._16_4_ * 0.0;
  auVar115._20_4_ = auVar109._20_4_ * 0.0;
  auVar115._24_4_ = auVar109._24_4_ * 0.0;
  auVar115._28_4_ = auVar109._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar98));
  auVar122._0_4_ = auVar19._0_4_ * auVar109._0_4_;
  auVar122._4_4_ = auVar19._4_4_ * auVar109._4_4_;
  auVar122._8_4_ = auVar19._8_4_ * auVar109._8_4_;
  auVar122._12_4_ = auVar19._12_4_ * auVar109._12_4_;
  auVar122._16_4_ = auVar109._16_4_ * 0.0;
  auVar122._20_4_ = auVar109._20_4_ * 0.0;
  auVar122._24_4_ = auVar109._24_4_ * 0.0;
  auVar122._28_4_ = 0;
  auVar109 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar102));
  auVar116._4_4_ = auVar94._4_4_ * auVar109._4_4_;
  auVar116._0_4_ = auVar94._0_4_ * auVar109._0_4_;
  auVar116._8_4_ = auVar94._8_4_ * auVar109._8_4_;
  auVar116._12_4_ = auVar94._12_4_ * auVar109._12_4_;
  auVar116._16_4_ = auVar109._16_4_ * 0.0;
  auVar116._20_4_ = auVar109._20_4_ * 0.0;
  auVar116._24_4_ = auVar109._24_4_ * 0.0;
  auVar116._28_4_ = auVar109._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar102));
  auVar121._0_4_ = auVar94._0_4_ * auVar109._0_4_;
  auVar121._4_4_ = auVar94._4_4_ * auVar109._4_4_;
  auVar121._8_4_ = auVar94._8_4_ * auVar109._8_4_;
  auVar121._12_4_ = auVar94._12_4_ * auVar109._12_4_;
  auVar121._16_4_ = auVar109._16_4_ * 0.0;
  auVar121._20_4_ = auVar109._20_4_ * 0.0;
  auVar121._24_4_ = auVar109._24_4_ * 0.0;
  auVar121._28_4_ = 0;
  auVar109 = vpminsd_avx2(auVar114,auVar123);
  auVar108 = vpminsd_avx2(auVar115,auVar122);
  auVar109 = vmaxps_avx(auVar109,auVar108);
  auVar108 = vpminsd_avx2(auVar116,auVar121);
  uVar185 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar110._4_4_ = uVar185;
  auVar110._0_4_ = uVar185;
  auVar110._8_4_ = uVar185;
  auVar110._12_4_ = uVar185;
  auVar110._16_4_ = uVar185;
  auVar110._20_4_ = uVar185;
  auVar110._24_4_ = uVar185;
  auVar110._28_4_ = uVar185;
  auVar108 = vmaxps_avx512vl(auVar108,auVar110);
  auVar109 = vmaxps_avx(auVar109,auVar108);
  auVar108._8_4_ = 0x3f7ffffa;
  auVar108._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar108._12_4_ = 0x3f7ffffa;
  auVar108._16_4_ = 0x3f7ffffa;
  auVar108._20_4_ = 0x3f7ffffa;
  auVar108._24_4_ = 0x3f7ffffa;
  auVar108._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar109,auVar108);
  auVar109 = vpmaxsd_avx2(auVar114,auVar123);
  auVar108 = vpmaxsd_avx2(auVar115,auVar122);
  auVar109 = vminps_avx(auVar109,auVar108);
  auVar108 = vpmaxsd_avx2(auVar116,auVar121);
  uVar185 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar111._4_4_ = uVar185;
  auVar111._0_4_ = uVar185;
  auVar111._8_4_ = uVar185;
  auVar111._12_4_ = uVar185;
  auVar111._16_4_ = uVar185;
  auVar111._20_4_ = uVar185;
  auVar111._24_4_ = uVar185;
  auVar111._28_4_ = uVar185;
  auVar108 = vminps_avx512vl(auVar108,auVar111);
  auVar109 = vminps_avx(auVar109,auVar108);
  auVar112._8_4_ = 0x3f800003;
  auVar112._0_8_ = 0x3f8000033f800003;
  auVar112._12_4_ = 0x3f800003;
  auVar112._16_4_ = 0x3f800003;
  auVar112._20_4_ = 0x3f800003;
  auVar112._24_4_ = 0x3f800003;
  auVar112._28_4_ = 0x3f800003;
  auVar109 = vmulps_avx512vl(auVar109,auVar112);
  auVar108 = vpbroadcastd_avx512vl();
  uVar22 = vpcmpgtd_avx512vl(auVar108,_DAT_01fe9900);
  uVar20 = vcmpps_avx512vl(local_300,auVar109,2);
  if ((byte)((byte)uVar20 & (byte)uVar22) == 0) {
    return;
  }
  local_6a8 = (ulong)(byte)((byte)uVar20 & (byte)uVar22);
  local_850 = (undefined1 (*) [32])&local_3c0;
  local_520 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6b0 = prim;
LAB_01dfdbd7:
  lVar88 = 0;
  for (uVar82 = local_6a8; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    lVar88 = lVar88 + 1;
  }
  uVar81 = *(uint *)(local_6b0 + 2);
  local_848 = (ulong)*(uint *)(local_6b0 + lVar88 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar81].ptr;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           local_848 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar263 = (pGVar5->time_range).lower;
  fVar263 = pGVar5->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar263) / ((pGVar5->time_range).upper - fVar263));
  auVar92 = vroundss_avx(ZEXT416((uint)fVar263),ZEXT416((uint)fVar263),9);
  auVar92 = vminss_avx(auVar92,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar92 = vmaxss_avx(ZEXT816(0) << 0x20,auVar92);
  fVar263 = fVar263 - auVar92._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar86 = (long)(int)auVar92._0_4_ * 0x38;
  lVar88 = *(long *)(_Var6 + 0x10 + lVar86);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar86);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar86);
  pfVar1 = (float *)(lVar7 + uVar82 * lVar8);
  auVar103._0_4_ = fVar263 * *pfVar1;
  auVar103._4_4_ = fVar263 * pfVar1[1];
  auVar103._8_4_ = fVar263 * pfVar1[2];
  auVar103._12_4_ = fVar263 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar82 + 1) * lVar8);
  auVar99._0_4_ = fVar263 * *pfVar1;
  auVar99._4_4_ = fVar263 * pfVar1[1];
  auVar99._8_4_ = fVar263 * pfVar1[2];
  auVar99._12_4_ = fVar263 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar82 + 2) * lVar8);
  auVar104._0_4_ = fVar263 * *pfVar1;
  auVar104._4_4_ = fVar263 * pfVar1[1];
  auVar104._8_4_ = fVar263 * pfVar1[2];
  auVar104._12_4_ = fVar263 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar82 + 3));
  auVar102._0_4_ = fVar263 * *pfVar1;
  auVar102._4_4_ = fVar263 * pfVar1[1];
  auVar102._8_4_ = fVar263 * pfVar1[2];
  auVar102._12_4_ = fVar263 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar86);
  fVar263 = 1.0 - fVar263;
  auVar98._4_4_ = fVar263;
  auVar98._0_4_ = fVar263;
  auVar98._8_4_ = fVar263;
  auVar98._12_4_ = fVar263;
  auVar94 = vfmadd231ps_fma(auVar103,auVar98,*(undefined1 (*) [16])(lVar7 + lVar88 * uVar82));
  auVar100 = vfmadd231ps_fma(auVar99,auVar98,*(undefined1 (*) [16])(lVar7 + lVar88 * (uVar82 + 1)));
  auVar2 = vfmadd231ps_fma(auVar104,auVar98,*(undefined1 (*) [16])(lVar7 + lVar88 * (uVar82 + 2)));
  auVar95 = vfmadd231ps_fma(auVar102,auVar98,*(undefined1 (*) [16])(lVar7 + lVar88 * (uVar82 + 3)));
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar19 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar185 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar275._4_4_ = uVar185;
  auVar275._0_4_ = uVar185;
  auVar275._8_4_ = uVar185;
  auVar275._12_4_ = uVar185;
  local_5a0._16_4_ = uVar185;
  local_5a0._0_16_ = auVar275;
  local_5a0._20_4_ = uVar185;
  local_5a0._24_4_ = uVar185;
  local_5a0._28_4_ = uVar185;
  auVar279 = ZEXT3264(local_5a0);
  uVar185 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar280._4_4_ = uVar185;
  auVar280._0_4_ = uVar185;
  auVar280._8_4_ = uVar185;
  auVar280._12_4_ = uVar185;
  local_5c0._16_4_ = uVar185;
  local_5c0._0_16_ = auVar280;
  local_5c0._20_4_ = uVar185;
  local_5c0._24_4_ = uVar185;
  local_5c0._28_4_ = uVar185;
  auVar92 = vunpcklps_avx(auVar275,auVar280);
  fVar263 = *(float *)(ray + k * 4 + 0xc0);
  auVar281._4_4_ = fVar263;
  auVar281._0_4_ = fVar263;
  auVar281._8_4_ = fVar263;
  auVar281._12_4_ = fVar263;
  local_5e0._16_4_ = fVar263;
  local_5e0._0_16_ = auVar281;
  local_5e0._20_4_ = fVar263;
  local_5e0._24_4_ = fVar263;
  local_5e0._28_4_ = fVar263;
  local_810 = vinsertps_avx(auVar92,auVar281,0x28);
  auVar271 = ZEXT1664(local_810);
  auVar251._0_4_ = auVar94._0_4_ + auVar100._0_4_ + auVar2._0_4_ + auVar95._0_4_;
  auVar251._4_4_ = auVar94._4_4_ + auVar100._4_4_ + auVar2._4_4_ + auVar95._4_4_;
  auVar251._8_4_ = auVar94._8_4_ + auVar100._8_4_ + auVar2._8_4_ + auVar95._8_4_;
  auVar251._12_4_ = auVar94._12_4_ + auVar100._12_4_ + auVar2._12_4_ + auVar95._12_4_;
  auVar97._8_4_ = 0x3e800000;
  auVar97._0_8_ = 0x3e8000003e800000;
  auVar97._12_4_ = 0x3e800000;
  auVar92 = vmulps_avx512vl(auVar251,auVar97);
  auVar92 = vsubps_avx(auVar92,auVar19);
  auVar92 = vdpps_avx(auVar92,local_810,0x7f);
  fVar160 = *(float *)(ray + k * 4 + 0x60);
  auVar272 = ZEXT464((uint)fVar160);
  local_820 = vdpps_avx(local_810,local_810,0x7f);
  auVar274 = ZEXT1664(local_820);
  auVar96 = ZEXT816(0) << 0x40;
  auVar267 = ZEXT1664(auVar96);
  auVar256._4_12_ = ZEXT812(0) << 0x20;
  auVar256._0_4_ = local_820._0_4_;
  auVar93 = vrcp14ss_avx512f(auVar96,auVar256);
  auVar101 = vfnmadd213ss_fma(auVar93,local_820,ZEXT416(0x40000000));
  local_2e0 = auVar92._0_4_ * auVar93._0_4_ * auVar101._0_4_;
  auVar254 = ZEXT464((uint)local_2e0);
  auVar257._4_4_ = local_2e0;
  auVar257._0_4_ = local_2e0;
  auVar257._8_4_ = local_2e0;
  auVar257._12_4_ = local_2e0;
  fStack_7f0 = local_2e0;
  _local_800 = auVar257;
  fStack_7ec = local_2e0;
  fStack_7e8 = local_2e0;
  fStack_7e4 = local_2e0;
  auVar92 = vfmadd231ps_fma(auVar19,local_810,auVar257);
  auVar92 = vblendps_avx(auVar92,auVar96,8);
  auVar19 = vsubps_avx(auVar94,auVar92);
  auVar94 = vsubps_avx(auVar2,auVar92);
  auVar100 = vsubps_avx(auVar100,auVar92);
  auVar92 = vsubps_avx(auVar95,auVar92);
  auVar262 = ZEXT1664(auVar92);
  auVar109 = vbroadcastss_avx512vl(auVar19);
  auVar132._8_4_ = 1;
  auVar132._0_8_ = 0x100000001;
  auVar132._12_4_ = 1;
  auVar132._16_4_ = 1;
  auVar132._20_4_ = 1;
  auVar132._24_4_ = 1;
  auVar132._28_4_ = 1;
  local_780 = ZEXT1632(auVar19);
  auVar108 = vpermps_avx512vl(auVar132,local_780);
  auVar133._8_4_ = 2;
  auVar133._0_8_ = 0x200000002;
  auVar133._12_4_ = 2;
  auVar133._16_4_ = 2;
  auVar133._20_4_ = 2;
  auVar133._24_4_ = 2;
  auVar133._28_4_ = 2;
  auVar110 = vpermps_avx512vl(auVar133,local_780);
  auVar134._8_4_ = 3;
  auVar134._0_8_ = 0x300000003;
  auVar134._12_4_ = 3;
  auVar134._16_4_ = 3;
  auVar134._20_4_ = 3;
  auVar134._24_4_ = 3;
  auVar134._28_4_ = 3;
  auVar111 = vpermps_avx512vl(auVar134,local_780);
  local_8e0 = vbroadcastss_avx512vl(auVar100);
  auVar282 = ZEXT3264(local_8e0);
  local_7c0 = ZEXT1632(auVar100);
  auVar112 = vpermps_avx512vl(auVar132,local_7c0);
  local_900 = vpermps_avx512vl(auVar133,local_7c0);
  auVar283 = ZEXT3264(local_900);
  auVar113 = vpermps_avx512vl(auVar134,local_7c0);
  local_920 = vbroadcastss_avx512vl(auVar94);
  auVar284 = ZEXT3264(local_920);
  local_7a0 = ZEXT1632(auVar94);
  local_940 = vpermps_avx512vl(auVar132,local_7a0);
  auVar285 = ZEXT3264(local_940);
  local_960 = vpermps_avx512vl(auVar133,local_7a0);
  auVar286 = ZEXT3264(local_960);
  auVar114 = vpermps_avx512vl(auVar134,local_7a0);
  local_260 = vbroadcastss_avx512vl(auVar92);
  _local_7e0 = ZEXT1632(auVar92);
  local_280 = vpermps_avx2(auVar132,_local_7e0);
  local_240 = vpermps_avx512vl(auVar133,_local_7e0);
  local_2c0 = vpermps_avx2(auVar134,_local_7e0);
  auVar92 = vfmadd231ps_fma(ZEXT432((uint)(fVar263 * fVar263)),local_5c0,local_5c0);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_5a0,local_5a0);
  local_220._0_4_ = auVar92._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar131._8_4_ = 0x7fffffff;
  auVar131._0_8_ = 0x7fffffff7fffffff;
  auVar131._12_4_ = 0x7fffffff;
  auVar131._16_4_ = 0x7fffffff;
  auVar131._20_4_ = 0x7fffffff;
  auVar131._24_4_ = 0x7fffffff;
  auVar131._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar131);
  local_710 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar160 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4c0 = vpbroadcastd_avx512vl();
  uVar82 = 0;
  iVar85 = 1;
  local_4e0 = vpbroadcastd_avx512vl();
  auVar92 = vsqrtss_avx(local_820,local_820);
  auVar19 = vsqrtss_avx(local_820,local_820);
  auVar201 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar288 = ZEXT3264(auVar115);
  local_2a0 = local_240;
  do {
    local_530 = auVar201._0_16_;
    auVar94 = vmovshdup_avx(local_530);
    auVar94 = vsubps_avx(auVar94,local_530);
    auVar169._0_4_ = auVar94._0_4_;
    fVar250 = auVar169._0_4_ * 0.04761905;
    uVar185 = auVar201._0_4_;
    local_880._4_4_ = uVar185;
    local_880._0_4_ = uVar185;
    local_880._8_4_ = uVar185;
    local_880._12_4_ = uVar185;
    local_880._16_4_ = uVar185;
    local_880._20_4_ = uVar185;
    local_880._24_4_ = uVar185;
    local_880._28_4_ = uVar185;
    auVar169._4_4_ = auVar169._0_4_;
    auVar169._8_4_ = auVar169._0_4_;
    auVar169._12_4_ = auVar169._0_4_;
    auVar169._16_4_ = auVar169._0_4_;
    auVar169._20_4_ = auVar169._0_4_;
    auVar169._24_4_ = auVar169._0_4_;
    auVar169._28_4_ = auVar169._0_4_;
    auVar94 = vfmadd231ps_fma(local_880,auVar169,_DAT_01faff20);
    auVar287 = auVar288._0_32_;
    auVar116 = vsubps_avx512vl(auVar287,ZEXT1632(auVar94));
    fVar263 = auVar116._0_4_;
    fVar269 = auVar116._4_4_;
    fVar239 = auVar116._8_4_;
    fVar241 = auVar116._12_4_;
    fVar223 = auVar116._16_4_;
    fVar248 = auVar116._20_4_;
    fVar249 = auVar116._24_4_;
    fVar161 = fVar263 * fVar263 * fVar263;
    fVar178 = fVar269 * fVar269 * fVar269;
    auVar236._4_4_ = fVar178;
    auVar236._0_4_ = fVar161;
    fVar179 = fVar239 * fVar239 * fVar239;
    auVar236._8_4_ = fVar179;
    fVar180 = fVar241 * fVar241 * fVar241;
    auVar236._12_4_ = fVar180;
    fVar181 = fVar223 * fVar223 * fVar223;
    auVar236._16_4_ = fVar181;
    fVar182 = fVar248 * fVar248 * fVar248;
    auVar236._20_4_ = fVar182;
    fVar184 = fVar249 * fVar249 * fVar249;
    auVar236._24_4_ = fVar184;
    auVar236._28_4_ = auVar169._0_4_;
    auVar115 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar117 = vmulps_avx512vl(auVar236,auVar115);
    fVar268 = auVar94._0_4_;
    fVar270 = auVar94._4_4_;
    fVar240 = auVar94._8_4_;
    fVar183 = auVar94._12_4_;
    fVar202 = fVar268 * fVar268 * fVar268;
    fVar220 = fVar270 * fVar270 * fVar270;
    fVar221 = fVar240 * fVar240 * fVar240;
    fVar222 = fVar183 * fVar183 * fVar183;
    auVar77._28_4_ = DAT_01faff20._28_4_;
    auVar77._0_28_ = ZEXT1628(CONCAT412(fVar222,CONCAT48(fVar221,CONCAT44(fVar220,fVar202))));
    auVar201._0_4_ = fVar268 * fVar263;
    auVar201._4_4_ = fVar270 * fVar269;
    auVar201._8_4_ = fVar240 * fVar239;
    auVar201._12_4_ = fVar183 * fVar241;
    auVar201._16_4_ = fVar223 * 0.0;
    auVar201._20_4_ = fVar248 * 0.0;
    auVar201._28_36_ = auVar271._28_36_;
    auVar201._24_4_ = fVar249 * 0.0;
    auVar107 = vmulps_avx512vl(auVar77,auVar115);
    fVar273 = auVar107._28_4_ + auVar169._0_4_;
    fVar255 = fVar273 + auVar274._28_4_ + auVar254._28_4_;
    auVar37._4_4_ = fVar178 * 0.16666667;
    auVar37._0_4_ = fVar161 * 0.16666667;
    auVar37._8_4_ = fVar179 * 0.16666667;
    auVar37._12_4_ = fVar180 * 0.16666667;
    auVar37._16_4_ = fVar181 * 0.16666667;
    auVar37._20_4_ = fVar182 * 0.16666667;
    auVar37._24_4_ = fVar184 * 0.16666667;
    auVar37._28_4_ = fVar273;
    auVar38._4_4_ =
         (auVar201._4_4_ * fVar269 * 12.0 + auVar201._4_4_ * fVar270 * 6.0 +
         fVar220 + auVar117._4_4_) * 0.16666667;
    auVar38._0_4_ =
         (auVar201._0_4_ * fVar263 * 12.0 + auVar201._0_4_ * fVar268 * 6.0 +
         fVar202 + auVar117._0_4_) * 0.16666667;
    auVar38._8_4_ =
         (auVar201._8_4_ * fVar239 * 12.0 + auVar201._8_4_ * fVar240 * 6.0 +
         fVar221 + auVar117._8_4_) * 0.16666667;
    auVar38._12_4_ =
         (auVar201._12_4_ * fVar241 * 12.0 + auVar201._12_4_ * fVar183 * 6.0 +
         fVar222 + auVar117._12_4_) * 0.16666667;
    auVar38._16_4_ =
         (auVar201._16_4_ * fVar223 * 12.0 + auVar201._16_4_ * 0.0 * 6.0 + auVar117._16_4_ + 0.0) *
         0.16666667;
    auVar38._20_4_ =
         (auVar201._20_4_ * fVar248 * 12.0 + auVar201._20_4_ * 0.0 * 6.0 + auVar117._20_4_ + 0.0) *
         0.16666667;
    auVar38._24_4_ =
         (auVar201._24_4_ * fVar249 * 12.0 + auVar201._24_4_ * 0.0 * 6.0 + auVar117._24_4_ + 0.0) *
         0.16666667;
    auVar38._28_4_ = auVar274._28_4_;
    auVar39._4_4_ =
         (auVar107._4_4_ + fVar178 +
         auVar201._4_4_ * fVar270 * 12.0 + auVar201._4_4_ * fVar269 * 6.0) * 0.16666667;
    auVar39._0_4_ =
         (auVar107._0_4_ + fVar161 +
         auVar201._0_4_ * fVar268 * 12.0 + auVar201._0_4_ * fVar263 * 6.0) * 0.16666667;
    auVar39._8_4_ =
         (auVar107._8_4_ + fVar179 +
         auVar201._8_4_ * fVar240 * 12.0 + auVar201._8_4_ * fVar239 * 6.0) * 0.16666667;
    auVar39._12_4_ =
         (auVar107._12_4_ + fVar180 +
         auVar201._12_4_ * fVar183 * 12.0 + auVar201._12_4_ * fVar241 * 6.0) * 0.16666667;
    auVar39._16_4_ =
         (auVar107._16_4_ + fVar181 + auVar201._16_4_ * 0.0 * 12.0 + auVar201._16_4_ * fVar223 * 6.0
         ) * 0.16666667;
    auVar39._20_4_ =
         (auVar107._20_4_ + fVar182 + auVar201._20_4_ * 0.0 * 12.0 + auVar201._20_4_ * fVar248 * 6.0
         ) * 0.16666667;
    auVar39._24_4_ =
         (auVar107._24_4_ + fVar184 + auVar201._24_4_ * 0.0 * 12.0 + auVar201._24_4_ * fVar249 * 6.0
         ) * 0.16666667;
    auVar39._28_4_ = auVar279._28_4_;
    fVar202 = fVar202 * 0.16666667;
    fVar220 = fVar220 * 0.16666667;
    fVar221 = fVar221 * 0.16666667;
    fVar222 = fVar222 * 0.16666667;
    auVar40._28_4_ = fVar255;
    auVar40._0_28_ = ZEXT1628(CONCAT412(fVar222,CONCAT48(fVar221,CONCAT44(fVar220,fVar202))));
    auVar107 = vmulps_avx512vl(local_260,auVar40);
    auVar41._4_4_ = local_280._4_4_ * fVar220;
    auVar41._0_4_ = local_280._0_4_ * fVar202;
    auVar41._8_4_ = local_280._8_4_ * fVar221;
    auVar41._12_4_ = local_280._12_4_ * fVar222;
    auVar41._16_4_ = local_280._16_4_ * 0.0;
    auVar41._20_4_ = local_280._20_4_ * 0.0;
    auVar41._24_4_ = local_280._24_4_ * 0.0;
    auVar41._28_4_ = auVar272._28_4_ + auVar279._28_4_ + DAT_01faff20._28_4_ + auVar117._28_4_;
    auVar117 = vmulps_avx512vl(local_2a0,auVar40);
    auVar42._4_4_ = local_2c0._4_4_ * fVar220;
    auVar42._0_4_ = local_2c0._0_4_ * fVar202;
    auVar42._8_4_ = local_2c0._8_4_ * fVar221;
    auVar42._12_4_ = local_2c0._12_4_ * fVar222;
    auVar42._16_4_ = local_2c0._16_4_ * 0.0;
    auVar42._20_4_ = local_2c0._20_4_ * 0.0;
    auVar42._24_4_ = local_2c0._24_4_ * 0.0;
    auVar42._28_4_ = fVar255;
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar39,auVar284._0_32_);
    auVar118 = vfmadd231ps_avx512vl(auVar41,auVar39,auVar285._0_32_);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar39,auVar286._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar42,auVar114,auVar39);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar38,auVar282._0_32_);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar38,auVar112);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar38,auVar283._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar113,auVar38);
    auVar105 = vfmadd231ps_avx512vl(auVar107,auVar37,auVar109);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar37,auVar108);
    auVar106 = vfmadd231ps_avx512vl(auVar117,auVar37,auVar110);
    auVar117 = vfmadd231ps_avx512vl(auVar119,auVar111,auVar37);
    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar107 = vxorps_avx512vl(auVar116,auVar119);
    auVar120 = vxorps_avx512vl(ZEXT1632(auVar94),auVar119);
    auVar244._0_4_ = auVar120._0_4_ * fVar268;
    auVar244._4_4_ = auVar120._4_4_ * fVar270;
    auVar244._8_4_ = auVar120._8_4_ * fVar240;
    auVar244._12_4_ = auVar120._12_4_ * fVar183;
    auVar244._16_4_ = auVar120._16_4_ * 0.0;
    auVar244._20_4_ = auVar120._20_4_ * 0.0;
    auVar244._24_4_ = auVar120._24_4_ * 0.0;
    auVar244._28_4_ = 0;
    auVar121 = vmulps_avx512vl(auVar201._0_32_,auVar115);
    auVar115 = vsubps_avx(auVar244,auVar121);
    auVar43._4_4_ = auVar107._4_4_ * fVar269 * 0.5;
    auVar43._0_4_ = auVar107._0_4_ * fVar263 * 0.5;
    auVar43._8_4_ = auVar107._8_4_ * fVar239 * 0.5;
    auVar43._12_4_ = auVar107._12_4_ * fVar241 * 0.5;
    auVar43._16_4_ = auVar107._16_4_ * fVar223 * 0.5;
    auVar43._20_4_ = auVar107._20_4_ * fVar248 * 0.5;
    auVar43._24_4_ = auVar107._24_4_ * fVar249 * 0.5;
    auVar43._28_4_ = auVar116._28_4_;
    auVar44._4_4_ = auVar115._4_4_ * 0.5;
    auVar44._0_4_ = auVar115._0_4_ * 0.5;
    auVar44._8_4_ = auVar115._8_4_ * 0.5;
    auVar44._12_4_ = auVar115._12_4_ * 0.5;
    auVar44._16_4_ = auVar115._16_4_ * 0.5;
    auVar44._20_4_ = auVar115._20_4_ * 0.5;
    auVar44._24_4_ = auVar115._24_4_ * 0.5;
    auVar44._28_4_ = auVar115._28_4_;
    auVar45._4_4_ = (auVar121._4_4_ + fVar269 * fVar269) * 0.5;
    auVar45._0_4_ = (auVar121._0_4_ + fVar263 * fVar263) * 0.5;
    auVar45._8_4_ = (auVar121._8_4_ + fVar239 * fVar239) * 0.5;
    auVar45._12_4_ = (auVar121._12_4_ + fVar241 * fVar241) * 0.5;
    auVar45._16_4_ = (auVar121._16_4_ + fVar223 * fVar223) * 0.5;
    auVar45._20_4_ = (auVar121._20_4_ + fVar248 * fVar248) * 0.5;
    auVar45._24_4_ = (auVar121._24_4_ + fVar249 * fVar249) * 0.5;
    auVar45._28_4_ = auVar121._28_4_ + auVar262._28_4_;
    fVar263 = fVar268 * fVar268 * 0.5;
    fVar268 = fVar270 * fVar270 * 0.5;
    fVar269 = fVar240 * fVar240 * 0.5;
    fVar270 = fVar183 * fVar183 * 0.5;
    auVar46._28_4_ = auVar267._28_4_;
    auVar46._0_28_ = ZEXT1628(CONCAT412(fVar270,CONCAT48(fVar269,CONCAT44(fVar268,fVar263))));
    auVar115 = vmulps_avx512vl(local_260,auVar46);
    auVar47._4_4_ = local_280._4_4_ * fVar268;
    auVar47._0_4_ = local_280._0_4_ * fVar263;
    auVar47._8_4_ = local_280._8_4_ * fVar269;
    auVar47._12_4_ = local_280._12_4_ * fVar270;
    auVar47._16_4_ = local_280._16_4_ * 0.0;
    auVar47._20_4_ = local_280._20_4_ * 0.0;
    auVar47._24_4_ = local_280._24_4_ * 0.0;
    auVar47._28_4_ = auVar120._28_4_;
    auVar116 = vmulps_avx512vl(local_2a0,auVar46);
    auVar48._4_4_ = fVar268 * local_2c0._4_4_;
    auVar48._0_4_ = fVar263 * local_2c0._0_4_;
    auVar48._8_4_ = fVar269 * local_2c0._8_4_;
    auVar48._12_4_ = fVar270 * local_2c0._12_4_;
    auVar48._16_4_ = local_2c0._16_4_ * 0.0;
    auVar48._20_4_ = local_2c0._20_4_ * 0.0;
    auVar48._24_4_ = local_2c0._24_4_ * 0.0;
    auVar48._28_4_ = auVar267._28_4_;
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar45,auVar284._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar47,auVar45,auVar285._0_32_);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar45,auVar286._0_32_);
    auVar94 = vfmadd231ps_fma(auVar48,auVar114,auVar45);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar44,auVar282._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar44,auVar112);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar44,auVar283._0_32_);
    auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar113,auVar44);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar43,auVar109);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar43,auVar108);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar43,auVar110);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar111,auVar43);
    auVar49._4_4_ = auVar115._4_4_ * fVar250;
    auVar49._0_4_ = auVar115._0_4_ * fVar250;
    auVar49._8_4_ = auVar115._8_4_ * fVar250;
    auVar49._12_4_ = auVar115._12_4_ * fVar250;
    auVar49._16_4_ = auVar115._16_4_ * fVar250;
    auVar49._20_4_ = auVar115._20_4_ * fVar250;
    auVar49._24_4_ = auVar115._24_4_ * fVar250;
    auVar49._28_4_ = auVar114._28_4_;
    auVar279 = ZEXT3264(auVar49);
    auVar50._4_4_ = auVar107._4_4_ * fVar250;
    auVar50._0_4_ = auVar107._0_4_ * fVar250;
    auVar50._8_4_ = auVar107._8_4_ * fVar250;
    auVar50._12_4_ = auVar107._12_4_ * fVar250;
    auVar50._16_4_ = auVar107._16_4_ * fVar250;
    auVar50._20_4_ = auVar107._20_4_ * fVar250;
    auVar50._24_4_ = auVar107._24_4_ * fVar250;
    auVar50._28_4_ = 0x3e2aaaab;
    auVar51._4_4_ = auVar116._4_4_ * fVar250;
    auVar51._0_4_ = auVar116._0_4_ * fVar250;
    auVar51._8_4_ = auVar116._8_4_ * fVar250;
    auVar51._12_4_ = auVar116._12_4_ * fVar250;
    auVar51._16_4_ = auVar116._16_4_ * fVar250;
    auVar51._20_4_ = auVar116._20_4_ * fVar250;
    auVar51._24_4_ = auVar116._24_4_ * fVar250;
    auVar51._28_4_ = 0x40c00000;
    fVar263 = auVar120._0_4_ * fVar250;
    fVar268 = auVar120._4_4_ * fVar250;
    auVar52._4_4_ = fVar268;
    auVar52._0_4_ = fVar263;
    fVar269 = auVar120._8_4_ * fVar250;
    auVar52._8_4_ = fVar269;
    fVar270 = auVar120._12_4_ * fVar250;
    auVar52._12_4_ = fVar270;
    fVar239 = auVar120._16_4_ * fVar250;
    auVar52._16_4_ = fVar239;
    fVar240 = auVar120._20_4_ * fVar250;
    auVar52._20_4_ = fVar240;
    fVar241 = auVar120._24_4_ * fVar250;
    auVar52._24_4_ = fVar241;
    auVar52._28_4_ = fVar250;
    auVar271 = ZEXT864(0) << 0x20;
    auVar120 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,ZEXT832(0) << 0x20);
    auVar121 = vpermt2ps_avx512vl(auVar118,_DAT_01feed00,ZEXT832(0) << 0x20);
    auVar272 = ZEXT3264(auVar121);
    auVar107 = ZEXT832(0) << 0x20;
    auVar122 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar107);
    auVar274 = ZEXT3264(auVar122);
    auVar245._0_4_ = fVar263 + auVar117._0_4_;
    auVar245._4_4_ = fVar268 + auVar117._4_4_;
    auVar245._8_4_ = fVar269 + auVar117._8_4_;
    auVar245._12_4_ = fVar270 + auVar117._12_4_;
    auVar245._16_4_ = fVar239 + auVar117._16_4_;
    auVar245._20_4_ = fVar240 + auVar117._20_4_;
    auVar245._24_4_ = fVar241 + auVar117._24_4_;
    auVar245._28_4_ = fVar250 + auVar117._28_4_;
    auVar115 = vmaxps_avx(auVar117,auVar245);
    auVar116 = vminps_avx(auVar117,auVar245);
    auVar123 = vpermt2ps_avx512vl(auVar117,_DAT_01feed00,auVar107);
    auVar124 = vpermt2ps_avx512vl(auVar49,_DAT_01feed00,auVar107);
    auVar267 = ZEXT3264(auVar124);
    auVar125 = vpermt2ps_avx512vl(auVar50,_DAT_01feed00,auVar107);
    auVar236 = ZEXT832(0) << 0x20;
    auVar126 = vpermt2ps_avx512vl(auVar51,_DAT_01feed00,auVar236);
    auVar117 = vpermt2ps_avx512vl(auVar52,_DAT_01feed00,auVar236);
    auVar127 = vsubps_avx512vl(auVar123,auVar117);
    auVar128 = vsubps_avx512vl(auVar120,auVar105);
    auVar262 = ZEXT3264(auVar128);
    auVar117 = vsubps_avx(auVar121,auVar118);
    auVar107 = vsubps_avx(auVar122,auVar106);
    auVar254 = ZEXT3264(auVar107);
    auVar129 = vmulps_avx512vl(auVar117,auVar51);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar50,auVar107);
    auVar130 = vmulps_avx512vl(auVar107,auVar49);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar51,auVar128);
    auVar131 = vmulps_avx512vl(auVar128,auVar50);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar49,auVar117);
    auVar131 = vmulps_avx512vl(auVar131,auVar131);
    auVar130 = vfmadd231ps_avx512vl(auVar131,auVar130,auVar130);
    auVar129 = vfmadd231ps_avx512vl(auVar130,auVar129,auVar129);
    auVar130 = vmulps_avx512vl(auVar107,auVar107);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar117,auVar117);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar128,auVar128);
    auVar131 = vrcp14ps_avx512vl(auVar130);
    auVar132 = vfnmadd213ps_avx512vl(auVar131,auVar130,auVar287);
    auVar131 = vfmadd132ps_avx512vl(auVar132,auVar131,auVar131);
    auVar129 = vmulps_avx512vl(auVar129,auVar131);
    auVar132 = vmulps_avx512vl(auVar117,auVar126);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar125,auVar107);
    auVar133 = vmulps_avx512vl(auVar107,auVar124);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar126,auVar128);
    auVar134 = vmulps_avx512vl(auVar128,auVar125);
    auVar134 = vfmsub231ps_avx512vl(auVar134,auVar124,auVar117);
    auVar134 = vmulps_avx512vl(auVar134,auVar134);
    auVar133 = vfmadd231ps_avx512vl(auVar134,auVar133,auVar133);
    auVar132 = vfmadd231ps_avx512vl(auVar133,auVar132,auVar132);
    auVar131 = vmulps_avx512vl(auVar132,auVar131);
    auVar129 = vmaxps_avx512vl(auVar129,auVar131);
    auVar129 = vsqrtps_avx512vl(auVar129);
    auVar131 = vmaxps_avx512vl(auVar127,auVar123);
    auVar115 = vmaxps_avx512vl(auVar115,auVar131);
    auVar131 = vaddps_avx512vl(auVar129,auVar115);
    auVar115 = vminps_avx512vl(auVar127,auVar123);
    auVar115 = vminps_avx(auVar116,auVar115);
    auVar115 = vsubps_avx512vl(auVar115,auVar129);
    auVar135._8_4_ = 0x3f800002;
    auVar135._0_8_ = 0x3f8000023f800002;
    auVar135._12_4_ = 0x3f800002;
    auVar135._16_4_ = 0x3f800002;
    auVar135._20_4_ = 0x3f800002;
    auVar135._24_4_ = 0x3f800002;
    auVar135._28_4_ = 0x3f800002;
    auVar116 = vmulps_avx512vl(auVar131,auVar135);
    auVar136._8_4_ = 0x3f7ffffc;
    auVar136._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar136._12_4_ = 0x3f7ffffc;
    auVar136._16_4_ = 0x3f7ffffc;
    auVar136._20_4_ = 0x3f7ffffc;
    auVar136._24_4_ = 0x3f7ffffc;
    auVar136._28_4_ = 0x3f7ffffc;
    auVar123 = vmulps_avx512vl(auVar115,auVar136);
    auVar127 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vrsqrt14ps_avx512vl(auVar130);
    auVar137._8_4_ = 0xbf000000;
    auVar137._0_8_ = 0xbf000000bf000000;
    auVar137._12_4_ = 0xbf000000;
    auVar137._16_4_ = 0xbf000000;
    auVar137._20_4_ = 0xbf000000;
    auVar137._24_4_ = 0xbf000000;
    auVar137._28_4_ = 0xbf000000;
    auVar116 = vmulps_avx512vl(auVar130,auVar137);
    fVar263 = auVar115._0_4_;
    fVar268 = auVar115._4_4_;
    fVar269 = auVar115._8_4_;
    fVar270 = auVar115._12_4_;
    fVar239 = auVar115._16_4_;
    fVar240 = auVar115._20_4_;
    fVar241 = auVar115._24_4_;
    auVar53._4_4_ = fVar268 * fVar268 * fVar268 * auVar116._4_4_;
    auVar53._0_4_ = fVar263 * fVar263 * fVar263 * auVar116._0_4_;
    auVar53._8_4_ = fVar269 * fVar269 * fVar269 * auVar116._8_4_;
    auVar53._12_4_ = fVar270 * fVar270 * fVar270 * auVar116._12_4_;
    auVar53._16_4_ = fVar239 * fVar239 * fVar239 * auVar116._16_4_;
    auVar53._20_4_ = fVar240 * fVar240 * fVar240 * auVar116._20_4_;
    auVar53._24_4_ = fVar241 * fVar241 * fVar241 * auVar116._24_4_;
    auVar53._28_4_ = auVar131._28_4_;
    auVar138._8_4_ = 0x3fc00000;
    auVar138._0_8_ = 0x3fc000003fc00000;
    auVar138._12_4_ = 0x3fc00000;
    auVar138._16_4_ = 0x3fc00000;
    auVar138._20_4_ = 0x3fc00000;
    auVar138._24_4_ = 0x3fc00000;
    auVar138._28_4_ = 0x3fc00000;
    auVar129 = vfmadd231ps_avx512vl(auVar53,auVar115,auVar138);
    auVar130 = vmulps_avx512vl(auVar128,auVar129);
    auVar131 = vmulps_avx512vl(auVar117,auVar129);
    auVar132 = vmulps_avx512vl(auVar107,auVar129);
    auVar115 = vsubps_avx(auVar236,auVar105);
    auVar116 = vsubps_avx(auVar236,auVar118);
    auVar133 = vsubps_avx512vl(auVar236,auVar106);
    auVar134 = vmulps_avx512vl(local_5e0,auVar133);
    auVar134 = vfmadd231ps_avx512vl(auVar134,local_5c0,auVar116);
    auVar134 = vfmadd231ps_avx512vl(auVar134,local_5a0,auVar115);
    auVar135 = vmulps_avx512vl(auVar133,auVar133);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar116,auVar116);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar115,auVar115);
    auVar136 = vmulps_avx512vl(local_5e0,auVar132);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar131,local_5c0);
    auVar136 = vfmadd231ps_avx512vl(auVar136,auVar130,local_5a0);
    auVar132 = vmulps_avx512vl(auVar133,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar116,auVar131);
    auVar130 = vfmadd231ps_avx512vl(auVar131,auVar115,auVar130);
    auVar131 = vmulps_avx512vl(auVar136,auVar136);
    auVar132 = vsubps_avx512vl(local_220,auVar131);
    auVar137 = vmulps_avx512vl(auVar136,auVar130);
    auVar134 = vsubps_avx512vl(auVar134,auVar137);
    auVar134 = vaddps_avx512vl(auVar134,auVar134);
    auVar137 = vmulps_avx512vl(auVar130,auVar130);
    local_840 = vsubps_avx512vl(auVar135,auVar137);
    auVar127 = vsubps_avx512vl(local_840,auVar127);
    local_760 = vmulps_avx512vl(auVar134,auVar134);
    auVar141._8_4_ = 0x40800000;
    auVar141._0_8_ = 0x4080000040800000;
    auVar141._12_4_ = 0x40800000;
    auVar141._16_4_ = 0x40800000;
    auVar141._20_4_ = 0x40800000;
    auVar141._24_4_ = 0x40800000;
    auVar141._28_4_ = 0x40800000;
    _local_8a0 = vmulps_avx512vl(auVar132,auVar141);
    auVar135 = vmulps_avx512vl(_local_8a0,auVar127);
    auVar135 = vsubps_avx512vl(local_760,auVar135);
    uVar89 = vcmpps_avx512vl(auVar135,auVar236,5);
    bVar78 = (byte)uVar89;
    fVar263 = (float)local_800._0_4_;
    fVar268 = (float)local_800._4_4_;
    fVar269 = fStack_7f8;
    fVar270 = fStack_7f4;
    fVar239 = fStack_7f0;
    fVar240 = fStack_7ec;
    fVar241 = fStack_7e8;
    fVar183 = fStack_7e4;
    if (bVar78 == 0) {
LAB_01dfe973:
      auVar282 = ZEXT3264(local_8e0);
      auVar283 = ZEXT3264(local_900);
      auVar284 = ZEXT3264(local_920);
      auVar285 = ZEXT3264(local_940);
      auVar286 = ZEXT3264(local_960);
    }
    else {
      auVar135 = vsqrtps_avx512vl(auVar135);
      auVar137 = vaddps_avx512vl(auVar132,auVar132);
      local_8c0 = vrcp14ps_avx512vl(auVar137);
      auVar138 = vfnmadd213ps_avx512vl(local_8c0,auVar137,auVar287);
      auVar138 = vfmadd132ps_avx512vl(auVar138,local_8c0,local_8c0);
      _local_620 = vxorps_avx512vl(auVar134,auVar119);
      auVar119 = vsubps_avx512vl(_local_620,auVar135);
      local_600 = vmulps_avx512vl(auVar119,auVar138);
      auVar119 = vsubps_avx512vl(auVar135,auVar134);
      local_640 = vmulps_avx512vl(auVar119,auVar138);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar135 = vblendmps_avx512vl(auVar119,local_600);
      auVar139._0_4_ =
           (uint)(bVar78 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar119._0_4_;
      bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
      auVar139._4_4_ = (uint)bVar11 * auVar135._4_4_ | (uint)!bVar11 * auVar119._4_4_;
      bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
      auVar139._8_4_ = (uint)bVar11 * auVar135._8_4_ | (uint)!bVar11 * auVar119._8_4_;
      bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
      auVar139._12_4_ = (uint)bVar11 * auVar135._12_4_ | (uint)!bVar11 * auVar119._12_4_;
      bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
      auVar139._16_4_ = (uint)bVar11 * auVar135._16_4_ | (uint)!bVar11 * auVar119._16_4_;
      bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
      auVar139._20_4_ = (uint)bVar11 * auVar135._20_4_ | (uint)!bVar11 * auVar119._20_4_;
      bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
      auVar139._24_4_ = (uint)bVar11 * auVar135._24_4_ | (uint)!bVar11 * auVar119._24_4_;
      bVar11 = SUB81(uVar89 >> 7,0);
      auVar139._28_4_ = (uint)bVar11 * auVar135._28_4_ | (uint)!bVar11 * auVar119._28_4_;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar135 = vblendmps_avx512vl(auVar119,local_640);
      auVar140._0_4_ =
           (uint)(bVar78 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar119._0_4_;
      bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
      auVar140._4_4_ = (uint)bVar11 * auVar135._4_4_ | (uint)!bVar11 * auVar119._4_4_;
      bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
      auVar140._8_4_ = (uint)bVar11 * auVar135._8_4_ | (uint)!bVar11 * auVar119._8_4_;
      bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
      auVar140._12_4_ = (uint)bVar11 * auVar135._12_4_ | (uint)!bVar11 * auVar119._12_4_;
      bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
      auVar140._16_4_ = (uint)bVar11 * auVar135._16_4_ | (uint)!bVar11 * auVar119._16_4_;
      bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
      auVar140._20_4_ = (uint)bVar11 * auVar135._20_4_ | (uint)!bVar11 * auVar119._20_4_;
      bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
      auVar140._24_4_ = (uint)bVar11 * auVar135._24_4_ | (uint)!bVar11 * auVar119._24_4_;
      bVar11 = SUB81(uVar89 >> 7,0);
      auVar140._28_4_ = (uint)bVar11 * auVar135._28_4_ | (uint)!bVar11 * auVar119._28_4_;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar131,auVar119);
      local_660 = vmaxps_avx512vl(local_240,auVar119);
      auVar271 = ZEXT3264(local_660);
      auVar287._8_4_ = 0x36000000;
      auVar287._0_8_ = 0x3600000036000000;
      auVar287._12_4_ = 0x36000000;
      auVar287._16_4_ = 0x36000000;
      auVar287._20_4_ = 0x36000000;
      auVar287._24_4_ = 0x36000000;
      auVar287._28_4_ = 0x36000000;
      local_680 = vmulps_avx512vl(local_660,auVar287);
      vandps_avx512vl(auVar132,auVar119);
      uVar21 = vcmpps_avx512vl(local_680,local_680,1);
      uVar89 = uVar89 & uVar21;
      bVar83 = (byte)uVar89;
      if (bVar83 != 0) {
        uVar21 = vcmpps_avx512vl(auVar127,_DAT_01faff00,2);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar127 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar131 = vblendmps_avx512vl(auVar119,auVar127);
        bVar84 = (byte)uVar21;
        uVar91 = (uint)(bVar84 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar84 & 1) * local_680._0_4_;
        bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
        uVar90 = (uint)bVar11 * auVar131._4_4_ | (uint)!bVar11 * local_680._4_4_;
        bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
        uVar153 = (uint)bVar11 * auVar131._8_4_ | (uint)!bVar11 * local_680._8_4_;
        bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
        uVar154 = (uint)bVar11 * auVar131._12_4_ | (uint)!bVar11 * local_680._12_4_;
        bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
        uVar155 = (uint)bVar11 * auVar131._16_4_ | (uint)!bVar11 * local_680._16_4_;
        bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
        uVar156 = (uint)bVar11 * auVar131._20_4_ | (uint)!bVar11 * local_680._20_4_;
        bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
        uVar157 = (uint)bVar11 * auVar131._24_4_ | (uint)!bVar11 * local_680._24_4_;
        bVar11 = SUB81(uVar21 >> 7,0);
        uVar158 = (uint)bVar11 * auVar131._28_4_ | (uint)!bVar11 * local_680._28_4_;
        auVar139._0_4_ = (bVar83 & 1) * uVar91 | !(bool)(bVar83 & 1) * auVar139._0_4_;
        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar139._4_4_ = bVar11 * uVar90 | !bVar11 * auVar139._4_4_;
        bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar139._8_4_ = bVar11 * uVar153 | !bVar11 * auVar139._8_4_;
        bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar139._12_4_ = bVar11 * uVar154 | !bVar11 * auVar139._12_4_;
        bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar139._16_4_ = bVar11 * uVar155 | !bVar11 * auVar139._16_4_;
        bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar139._20_4_ = bVar11 * uVar156 | !bVar11 * auVar139._20_4_;
        bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar139._24_4_ = bVar11 * uVar157 | !bVar11 * auVar139._24_4_;
        bVar11 = SUB81(uVar89 >> 7,0);
        auVar139._28_4_ = bVar11 * uVar158 | !bVar11 * auVar139._28_4_;
        auVar119 = vblendmps_avx512vl(auVar127,auVar119);
        bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
        bVar18 = SUB81(uVar21 >> 7,0);
        auVar140._0_4_ =
             (uint)(bVar83 & 1) *
             ((uint)(bVar84 & 1) * auVar119._0_4_ | !(bool)(bVar84 & 1) * uVar91) |
             !(bool)(bVar83 & 1) * auVar140._0_4_;
        bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar140._4_4_ =
             (uint)bVar12 * ((uint)bVar11 * auVar119._4_4_ | !bVar11 * uVar90) |
             !bVar12 * auVar140._4_4_;
        bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar140._8_4_ =
             (uint)bVar11 * ((uint)bVar13 * auVar119._8_4_ | !bVar13 * uVar153) |
             !bVar11 * auVar140._8_4_;
        bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar140._12_4_ =
             (uint)bVar11 * ((uint)bVar14 * auVar119._12_4_ | !bVar14 * uVar154) |
             !bVar11 * auVar140._12_4_;
        bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar140._16_4_ =
             (uint)bVar11 * ((uint)bVar15 * auVar119._16_4_ | !bVar15 * uVar155) |
             !bVar11 * auVar140._16_4_;
        bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar140._20_4_ =
             (uint)bVar11 * ((uint)bVar16 * auVar119._20_4_ | !bVar16 * uVar156) |
             !bVar11 * auVar140._20_4_;
        bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar140._24_4_ =
             (uint)bVar11 * ((uint)bVar17 * auVar119._24_4_ | !bVar17 * uVar157) |
             !bVar11 * auVar140._24_4_;
        bVar11 = SUB81(uVar89 >> 7,0);
        auVar140._28_4_ =
             (uint)bVar11 * ((uint)bVar18 * auVar119._28_4_ | !bVar18 * uVar158) |
             !bVar11 * auVar140._28_4_;
        bVar78 = (~bVar83 | bVar84) & bVar78;
      }
      if ((bVar78 & 0x7f) == 0) {
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar288 = ZEXT3264(auVar115);
        auVar282 = ZEXT3264(local_8e0);
        auVar283 = ZEXT3264(local_900);
        auVar284 = ZEXT3264(local_920);
        auVar285 = ZEXT3264(local_940);
        auVar286 = ZEXT3264(local_960);
      }
      else {
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar126 = vxorps_avx512vl(auVar126,auVar119);
        auVar124 = vxorps_avx512vl(auVar124,auVar119);
        uVar91 = *(uint *)(ray + k * 4 + 0x100);
        auVar125 = vxorps_avx512vl(auVar125,auVar119);
        auVar94 = vsubss_avx512f(ZEXT416(uVar91),ZEXT416((uint)local_710._0_4_));
        auVar127 = vbroadcastss_avx512vl(auVar94);
        auVar127 = vminps_avx512vl(auVar127,auVar140);
        auVar76._4_4_ = fStack_2dc;
        auVar76._0_4_ = local_2e0;
        auVar76._8_4_ = fStack_2d8;
        auVar76._12_4_ = fStack_2d4;
        auVar76._16_4_ = fStack_2d0;
        auVar76._20_4_ = fStack_2cc;
        auVar76._24_4_ = fStack_2c8;
        auVar76._28_4_ = fStack_2c4;
        auVar131 = vmaxps_avx512vl(auVar76,auVar139);
        auVar132 = vmulps_avx512vl(auVar51,auVar133);
        auVar116 = vfmadd213ps_avx512vl(auVar116,auVar50,auVar132);
        auVar94 = vfmadd213ps_fma(auVar115,auVar49,auVar116);
        auVar115 = vmulps_avx512vl(local_5e0,auVar51);
        auVar115 = vfmadd231ps_avx512vl(auVar115,local_5c0,auVar50);
        auVar100 = vfmadd231ps_fma(auVar115,local_5a0,auVar49);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar100),auVar115);
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar20 = vcmpps_avx512vl(auVar115,auVar116,1);
        auVar132 = vxorps_avx512vl(ZEXT1632(auVar94),auVar119);
        auVar133 = vrcp14ps_avx512vl(ZEXT1632(auVar100));
        auVar236 = ZEXT1632(auVar100);
        auVar135 = vxorps_avx512vl(auVar236,auVar119);
        auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar141 = vfnmadd213ps_avx512vl(auVar133,auVar236,auVar138);
        auVar94 = vfmadd132ps_fma(auVar141,auVar133,auVar133);
        fVar223 = auVar94._0_4_ * auVar132._0_4_;
        fVar248 = auVar94._4_4_ * auVar132._4_4_;
        auVar54._4_4_ = fVar248;
        auVar54._0_4_ = fVar223;
        fVar249 = auVar94._8_4_ * auVar132._8_4_;
        auVar54._8_4_ = fVar249;
        fVar250 = auVar94._12_4_ * auVar132._12_4_;
        auVar54._12_4_ = fVar250;
        fVar161 = auVar132._16_4_ * 0.0;
        auVar54._16_4_ = fVar161;
        fVar178 = auVar132._20_4_ * 0.0;
        auVar54._20_4_ = fVar178;
        fVar179 = auVar132._24_4_ * 0.0;
        auVar54._24_4_ = fVar179;
        auVar54._28_4_ = auVar132._28_4_;
        uVar22 = vcmpps_avx512vl(auVar236,auVar135,1);
        bVar83 = (byte)uVar20 | (byte)uVar22;
        auVar278._8_4_ = 0xff800000;
        auVar278._0_8_ = 0xff800000ff800000;
        auVar278._12_4_ = 0xff800000;
        auVar278._16_4_ = 0xff800000;
        auVar278._20_4_ = 0xff800000;
        auVar278._24_4_ = 0xff800000;
        auVar278._28_4_ = 0xff800000;
        auVar133 = vblendmps_avx512vl(auVar54,auVar278);
        auVar142._0_4_ = (uint)(bVar83 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar83 & 1) * -0x800000
        ;
        bVar11 = (bool)(bVar83 >> 1 & 1);
        auVar142._4_4_ = (uint)bVar11 * auVar133._4_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)(bVar83 >> 2 & 1);
        auVar142._8_4_ = (uint)bVar11 * auVar133._8_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)(bVar83 >> 3 & 1);
        auVar142._12_4_ = (uint)bVar11 * auVar133._12_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)(bVar83 >> 4 & 1);
        auVar142._16_4_ = (uint)bVar11 * auVar133._16_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)(bVar83 >> 5 & 1);
        auVar142._20_4_ = (uint)bVar11 * auVar133._20_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)(bVar83 >> 6 & 1);
        auVar142._24_4_ = (uint)bVar11 * auVar133._24_4_ | (uint)!bVar11 * -0x800000;
        auVar142._28_4_ =
             (uint)(bVar83 >> 7) * auVar133._28_4_ | (uint)!(bool)(bVar83 >> 7) * -0x800000;
        auVar133 = vmaxps_avx512vl(auVar131,auVar142);
        auVar279 = ZEXT3264(auVar133);
        uVar22 = vcmpps_avx512vl(auVar236,auVar135,6);
        bVar83 = (byte)uVar20 | (byte)uVar22;
        auVar143._0_4_ = (uint)(bVar83 & 1) * 0x7f800000 | (uint)!(bool)(bVar83 & 1) * (int)fVar223;
        bVar11 = (bool)(bVar83 >> 1 & 1);
        auVar143._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar248;
        bVar11 = (bool)(bVar83 >> 2 & 1);
        auVar143._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar249;
        bVar11 = (bool)(bVar83 >> 3 & 1);
        auVar143._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar250;
        bVar11 = (bool)(bVar83 >> 4 & 1);
        auVar143._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar161;
        bVar11 = (bool)(bVar83 >> 5 & 1);
        auVar143._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar178;
        bVar11 = (bool)(bVar83 >> 6 & 1);
        auVar143._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar179;
        auVar143._28_4_ =
             (uint)(bVar83 >> 7) * 0x7f800000 | (uint)!(bool)(bVar83 >> 7) * auVar132._28_4_;
        auVar127 = vminps_avx512vl(auVar127,auVar143);
        auVar94 = vxorps_avx512vl(auVar131._0_16_,auVar131._0_16_);
        auVar120 = vsubps_avx512vl(ZEXT1632(auVar94),auVar120);
        auVar121 = vsubps_avx512vl(ZEXT1632(auVar94),auVar121);
        auVar131 = ZEXT1632(auVar94);
        auVar122 = vsubps_avx512vl(auVar131,auVar122);
        auVar122 = vmulps_avx512vl(auVar122,auVar126);
        auVar121 = vfmadd231ps_avx512vl(auVar122,auVar125,auVar121);
        auVar120 = vfmadd231ps_avx512vl(auVar121,auVar124,auVar120);
        auVar121 = vmulps_avx512vl(local_5e0,auVar126);
        auVar121 = vfmadd231ps_avx512vl(auVar121,local_5c0,auVar125);
        auVar288 = ZEXT3264(auVar138);
        auVar121 = vfmadd231ps_avx512vl(auVar121,local_5a0,auVar124);
        vandps_avx512vl(auVar121,auVar115);
        uVar20 = vcmpps_avx512vl(auVar121,auVar116,1);
        auVar115 = vxorps_avx512vl(auVar120,auVar119);
        auVar116 = vrcp14ps_avx512vl(auVar121);
        auVar119 = vxorps_avx512vl(auVar121,auVar119);
        auVar274 = ZEXT3264(auVar119);
        auVar120 = vfnmadd213ps_avx512vl(auVar116,auVar121,auVar138);
        auVar94 = vfmadd132ps_fma(auVar120,auVar116,auVar116);
        fVar223 = auVar94._0_4_ * auVar115._0_4_;
        fVar248 = auVar94._4_4_ * auVar115._4_4_;
        auVar55._4_4_ = fVar248;
        auVar55._0_4_ = fVar223;
        fVar249 = auVar94._8_4_ * auVar115._8_4_;
        auVar55._8_4_ = fVar249;
        fVar250 = auVar94._12_4_ * auVar115._12_4_;
        auVar55._12_4_ = fVar250;
        fVar161 = auVar115._16_4_ * 0.0;
        auVar55._16_4_ = fVar161;
        fVar178 = auVar115._20_4_ * 0.0;
        auVar55._20_4_ = fVar178;
        fVar179 = auVar115._24_4_ * 0.0;
        auVar55._24_4_ = fVar179;
        auVar55._28_4_ = auVar115._28_4_;
        uVar22 = vcmpps_avx512vl(auVar121,auVar119,1);
        bVar83 = (byte)uVar20 | (byte)uVar22;
        auVar31._8_4_ = 0xff800000;
        auVar31._0_8_ = 0xff800000ff800000;
        auVar31._12_4_ = 0xff800000;
        auVar31._16_4_ = 0xff800000;
        auVar31._20_4_ = 0xff800000;
        auVar31._24_4_ = 0xff800000;
        auVar31._28_4_ = 0xff800000;
        auVar120 = vblendmps_avx512vl(auVar55,auVar31);
        auVar144._0_4_ =
             (uint)(bVar83 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar116._0_4_;
        bVar11 = (bool)(bVar83 >> 1 & 1);
        auVar144._4_4_ = (uint)bVar11 * auVar120._4_4_ | (uint)!bVar11 * auVar116._4_4_;
        bVar11 = (bool)(bVar83 >> 2 & 1);
        auVar144._8_4_ = (uint)bVar11 * auVar120._8_4_ | (uint)!bVar11 * auVar116._8_4_;
        bVar11 = (bool)(bVar83 >> 3 & 1);
        auVar144._12_4_ = (uint)bVar11 * auVar120._12_4_ | (uint)!bVar11 * auVar116._12_4_;
        bVar11 = (bool)(bVar83 >> 4 & 1);
        auVar144._16_4_ = (uint)bVar11 * auVar120._16_4_ | (uint)!bVar11 * auVar116._16_4_;
        bVar11 = (bool)(bVar83 >> 5 & 1);
        auVar144._20_4_ = (uint)bVar11 * auVar120._20_4_ | (uint)!bVar11 * auVar116._20_4_;
        bVar11 = (bool)(bVar83 >> 6 & 1);
        auVar144._24_4_ = (uint)bVar11 * auVar120._24_4_ | (uint)!bVar11 * auVar116._24_4_;
        auVar144._28_4_ =
             (uint)(bVar83 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar83 >> 7) * auVar116._28_4_;
        auVar272 = ZEXT3264(auVar144);
        _local_6a0 = vmaxps_avx(auVar133,auVar144);
        auVar267 = ZEXT3264(_local_6a0);
        uVar22 = vcmpps_avx512vl(auVar121,auVar119,6);
        bVar83 = (byte)uVar20 | (byte)uVar22;
        auVar145._0_4_ = (uint)(bVar83 & 1) * 0x7f800000 | (uint)!(bool)(bVar83 & 1) * (int)fVar223;
        bVar11 = (bool)(bVar83 >> 1 & 1);
        auVar145._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar248;
        bVar11 = (bool)(bVar83 >> 2 & 1);
        auVar145._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar249;
        bVar11 = (bool)(bVar83 >> 3 & 1);
        auVar145._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar250;
        bVar11 = (bool)(bVar83 >> 4 & 1);
        auVar145._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar161;
        bVar11 = (bool)(bVar83 >> 5 & 1);
        auVar145._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar178;
        bVar11 = (bool)(bVar83 >> 6 & 1);
        auVar145._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar179;
        auVar145._28_4_ =
             (uint)(bVar83 >> 7) * 0x7f800000 | (uint)!(bool)(bVar83 >> 7) * auVar115._28_4_;
        local_360 = vminps_avx(auVar127,auVar145);
        auVar271 = ZEXT3264(local_360);
        uVar20 = vcmpps_avx512vl(_local_6a0,local_360,2);
        bVar78 = bVar78 & 0x7f & (byte)uVar20;
        if (bVar78 == 0) goto LAB_01dfe973;
        auVar116 = vmaxps_avx512vl(auVar131,auVar123);
        auVar115 = vfmadd213ps_avx512vl(local_600,auVar136,auVar130);
        fVar223 = auVar129._0_4_;
        fVar248 = auVar129._4_4_;
        auVar56._4_4_ = fVar248 * auVar115._4_4_;
        auVar56._0_4_ = fVar223 * auVar115._0_4_;
        fVar249 = auVar129._8_4_;
        auVar56._8_4_ = fVar249 * auVar115._8_4_;
        fVar250 = auVar129._12_4_;
        auVar56._12_4_ = fVar250 * auVar115._12_4_;
        fVar161 = auVar129._16_4_;
        auVar56._16_4_ = fVar161 * auVar115._16_4_;
        fVar178 = auVar129._20_4_;
        auVar56._20_4_ = fVar178 * auVar115._20_4_;
        fVar179 = auVar129._24_4_;
        auVar56._24_4_ = fVar179 * auVar115._24_4_;
        auVar56._28_4_ = auVar115._28_4_;
        auVar115 = vfmadd213ps_avx512vl(local_640,auVar136,auVar130);
        auVar57._4_4_ = fVar248 * auVar115._4_4_;
        auVar57._0_4_ = fVar223 * auVar115._0_4_;
        auVar57._8_4_ = fVar249 * auVar115._8_4_;
        auVar57._12_4_ = fVar250 * auVar115._12_4_;
        auVar57._16_4_ = fVar161 * auVar115._16_4_;
        auVar57._20_4_ = fVar178 * auVar115._20_4_;
        auVar57._24_4_ = fVar179 * auVar115._24_4_;
        auVar57._28_4_ = auVar144._28_4_;
        auVar115 = vminps_avx512vl(auVar56,auVar138);
        auVar64 = ZEXT812(0);
        auVar119 = ZEXT1232(auVar64) << 0x20;
        auVar115 = vmaxps_avx(auVar115,ZEXT1232(auVar64) << 0x20);
        auVar120 = vminps_avx512vl(auVar57,auVar138);
        auVar58._4_4_ = (auVar115._4_4_ + 1.0) * 0.125;
        auVar58._0_4_ = (auVar115._0_4_ + 0.0) * 0.125;
        auVar58._8_4_ = (auVar115._8_4_ + 2.0) * 0.125;
        auVar58._12_4_ = (auVar115._12_4_ + 3.0) * 0.125;
        auVar58._16_4_ = (auVar115._16_4_ + 4.0) * 0.125;
        auVar58._20_4_ = (auVar115._20_4_ + 5.0) * 0.125;
        auVar58._24_4_ = (auVar115._24_4_ + 6.0) * 0.125;
        auVar58._28_4_ = auVar115._28_4_ + 7.0;
        auVar94 = vfmadd213ps_fma(auVar58,auVar169,local_880);
        local_1a0 = ZEXT1632(auVar94);
        auVar115 = vmaxps_avx(auVar120,ZEXT1232(auVar64) << 0x20);
        auVar59._4_4_ = (auVar115._4_4_ + 1.0) * 0.125;
        auVar59._0_4_ = (auVar115._0_4_ + 0.0) * 0.125;
        auVar59._8_4_ = (auVar115._8_4_ + 2.0) * 0.125;
        auVar59._12_4_ = (auVar115._12_4_ + 3.0) * 0.125;
        auVar59._16_4_ = (auVar115._16_4_ + 4.0) * 0.125;
        auVar59._20_4_ = (auVar115._20_4_ + 5.0) * 0.125;
        auVar59._24_4_ = (auVar115._24_4_ + 6.0) * 0.125;
        auVar59._28_4_ = auVar115._28_4_ + 7.0;
        auVar94 = vfmadd213ps_fma(auVar59,auVar169,local_880);
        local_1c0 = ZEXT1632(auVar94);
        auVar60._4_4_ = auVar116._4_4_ * auVar116._4_4_;
        auVar60._0_4_ = auVar116._0_4_ * auVar116._0_4_;
        auVar60._8_4_ = auVar116._8_4_ * auVar116._8_4_;
        auVar60._12_4_ = auVar116._12_4_ * auVar116._12_4_;
        auVar60._16_4_ = auVar116._16_4_ * auVar116._16_4_;
        auVar60._20_4_ = auVar116._20_4_ * auVar116._20_4_;
        auVar60._24_4_ = auVar116._24_4_ * auVar116._24_4_;
        auVar60._28_4_ = auVar116._28_4_;
        auVar115 = vsubps_avx(local_840,auVar60);
        auVar61._4_4_ = auVar115._4_4_ * (float)local_8a0._4_4_;
        auVar61._0_4_ = auVar115._0_4_ * (float)local_8a0._0_4_;
        auVar61._8_4_ = auVar115._8_4_ * fStack_898;
        auVar61._12_4_ = auVar115._12_4_ * fStack_894;
        auVar61._16_4_ = auVar115._16_4_ * fStack_890;
        auVar61._20_4_ = auVar115._20_4_ * fStack_88c;
        auVar61._24_4_ = auVar115._24_4_ * fStack_888;
        auVar61._28_4_ = auVar116._28_4_;
        auVar116 = vsubps_avx(local_760,auVar61);
        uVar20 = vcmpps_avx512vl(auVar116,ZEXT1232(auVar64) << 0x20,5);
        bVar83 = (byte)uVar20;
        auVar284 = ZEXT3264(local_920);
        auVar285 = ZEXT3264(local_940);
        auVar286 = ZEXT3264(local_960);
        if (bVar83 == 0) {
          bVar83 = 0;
          auVar117 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar201 = ZEXT864(0) << 0x20;
          auVar116 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar120 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar272 = ZEXT864(0) << 0x20;
          auVar146._8_4_ = 0x7f800000;
          auVar146._0_8_ = 0x7f8000007f800000;
          auVar146._12_4_ = 0x7f800000;
          auVar146._16_4_ = 0x7f800000;
          auVar146._20_4_ = 0x7f800000;
          auVar146._24_4_ = 0x7f800000;
          auVar146._28_4_ = 0x7f800000;
          auVar147._8_4_ = 0xff800000;
          auVar147._0_8_ = 0xff800000ff800000;
          auVar147._12_4_ = 0xff800000;
          auVar147._16_4_ = 0xff800000;
          auVar147._20_4_ = 0xff800000;
          auVar147._24_4_ = 0xff800000;
          auVar147._28_4_ = 0xff800000;
        }
        else {
          uVar89 = vcmpps_avx512vl(auVar116,auVar131,5);
          auVar116 = vsqrtps_avx(auVar116);
          auVar119 = vfnmadd213ps_avx512vl(auVar137,local_8c0,auVar138);
          auVar121 = vfmadd132ps_avx512vl(auVar119,local_8c0,local_8c0);
          auVar119 = vsubps_avx(_local_620,auVar116);
          auVar122 = vmulps_avx512vl(auVar119,auVar121);
          auVar116 = vsubps_avx512vl(auVar116,auVar134);
          auVar121 = vmulps_avx512vl(auVar116,auVar121);
          auVar116 = vfmadd213ps_avx512vl(auVar136,auVar122,auVar130);
          auVar62._4_4_ = fVar248 * auVar116._4_4_;
          auVar62._0_4_ = fVar223 * auVar116._0_4_;
          auVar62._8_4_ = fVar249 * auVar116._8_4_;
          auVar62._12_4_ = fVar250 * auVar116._12_4_;
          auVar62._16_4_ = fVar161 * auVar116._16_4_;
          auVar62._20_4_ = fVar178 * auVar116._20_4_;
          auVar62._24_4_ = fVar179 * auVar116._24_4_;
          auVar62._28_4_ = auVar120._28_4_;
          auVar116 = vmulps_avx512vl(local_5a0,auVar122);
          auVar119 = vmulps_avx512vl(local_5c0,auVar122);
          auVar123 = vmulps_avx512vl(local_5e0,auVar122);
          auVar120 = vfmadd213ps_avx512vl(auVar128,auVar62,auVar105);
          auVar116 = vsubps_avx512vl(auVar116,auVar120);
          auVar120 = vfmadd213ps_avx512vl(auVar117,auVar62,auVar118);
          auVar120 = vsubps_avx512vl(auVar119,auVar120);
          auVar94 = vfmadd213ps_fma(auVar62,auVar107,auVar106);
          auVar119 = vsubps_avx(auVar123,ZEXT1632(auVar94));
          auVar272 = ZEXT3264(auVar119);
          auVar119 = vfmadd213ps_avx512vl(auVar136,auVar121,auVar130);
          auVar123 = vmulps_avx512vl(auVar129,auVar119);
          auVar119 = vmulps_avx512vl(local_5a0,auVar121);
          auVar124 = vmulps_avx512vl(local_5c0,auVar121);
          auVar125 = vmulps_avx512vl(local_5e0,auVar121);
          auVar94 = vfmadd213ps_fma(auVar128,auVar123,auVar105);
          auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar94));
          auVar94 = vfmadd213ps_fma(auVar117,auVar123,auVar118);
          auVar117 = vsubps_avx512vl(auVar124,ZEXT1632(auVar94));
          auVar94 = vfmadd213ps_fma(auVar107,auVar123,auVar106);
          auVar107 = vsubps_avx512vl(auVar125,ZEXT1632(auVar94));
          auVar201 = ZEXT3264(auVar107);
          auVar170._8_4_ = 0x7f800000;
          auVar170._0_8_ = 0x7f8000007f800000;
          auVar170._12_4_ = 0x7f800000;
          auVar170._16_4_ = 0x7f800000;
          auVar170._20_4_ = 0x7f800000;
          auVar170._24_4_ = 0x7f800000;
          auVar170._28_4_ = 0x7f800000;
          auVar107 = vblendmps_avx512vl(auVar170,auVar122);
          bVar11 = (bool)((byte)uVar89 & 1);
          auVar146._0_4_ = (uint)bVar11 * auVar107._0_4_ | (uint)!bVar11 * auVar105._0_4_;
          bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar146._4_4_ = (uint)bVar11 * auVar107._4_4_ | (uint)!bVar11 * auVar105._4_4_;
          bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar146._8_4_ = (uint)bVar11 * auVar107._8_4_ | (uint)!bVar11 * auVar105._8_4_;
          bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar146._12_4_ = (uint)bVar11 * auVar107._12_4_ | (uint)!bVar11 * auVar105._12_4_;
          bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar146._16_4_ = (uint)bVar11 * auVar107._16_4_ | (uint)!bVar11 * auVar105._16_4_;
          bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar146._20_4_ = (uint)bVar11 * auVar107._20_4_ | (uint)!bVar11 * auVar105._20_4_;
          bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar146._24_4_ = (uint)bVar11 * auVar107._24_4_ | (uint)!bVar11 * auVar105._24_4_;
          bVar11 = SUB81(uVar89 >> 7,0);
          auVar146._28_4_ = (uint)bVar11 * auVar107._28_4_ | (uint)!bVar11 * auVar105._28_4_;
          auVar171._8_4_ = 0xff800000;
          auVar171._0_8_ = 0xff800000ff800000;
          auVar171._12_4_ = 0xff800000;
          auVar171._16_4_ = 0xff800000;
          auVar171._20_4_ = 0xff800000;
          auVar171._24_4_ = 0xff800000;
          auVar171._28_4_ = 0xff800000;
          auVar107 = vblendmps_avx512vl(auVar171,auVar121);
          bVar11 = (bool)((byte)uVar89 & 1);
          auVar147._0_4_ = (uint)bVar11 * auVar107._0_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar147._4_4_ = (uint)bVar11 * auVar107._4_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar147._8_4_ = (uint)bVar11 * auVar107._8_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar147._12_4_ = (uint)bVar11 * auVar107._12_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar147._16_4_ = (uint)bVar11 * auVar107._16_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar147._20_4_ = (uint)bVar11 * auVar107._20_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar147._24_4_ = (uint)bVar11 * auVar107._24_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = SUB81(uVar89 >> 7,0);
          auVar147._28_4_ = (uint)bVar11 * auVar107._28_4_ | (uint)!bVar11 * -0x800000;
          auVar32._8_4_ = 0x36000000;
          auVar32._0_8_ = 0x3600000036000000;
          auVar32._12_4_ = 0x36000000;
          auVar32._16_4_ = 0x36000000;
          auVar32._20_4_ = 0x36000000;
          auVar32._24_4_ = 0x36000000;
          auVar32._28_4_ = 0x36000000;
          auVar107 = vmulps_avx512vl(local_660,auVar32);
          uVar21 = vcmpps_avx512vl(auVar107,local_680,0xe);
          uVar89 = uVar89 & uVar21;
          bVar84 = (byte)uVar89;
          if (bVar84 != 0) {
            uVar21 = vcmpps_avx512vl(auVar115,ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar261._8_4_ = 0x7f800000;
            auVar261._0_8_ = 0x7f8000007f800000;
            auVar261._12_4_ = 0x7f800000;
            auVar261._16_4_ = 0x7f800000;
            auVar261._20_4_ = 0x7f800000;
            auVar261._24_4_ = 0x7f800000;
            auVar261._28_4_ = 0x7f800000;
            auVar266._8_4_ = 0xff800000;
            auVar266._0_8_ = 0xff800000ff800000;
            auVar266._12_4_ = 0xff800000;
            auVar266._16_4_ = 0xff800000;
            auVar266._20_4_ = 0xff800000;
            auVar266._24_4_ = 0xff800000;
            auVar266._28_4_ = 0xff800000;
            auVar115 = vblendmps_avx512vl(auVar261,auVar266);
            bVar87 = (byte)uVar21;
            uVar90 = (uint)(bVar87 & 1) * auVar115._0_4_ |
                     (uint)!(bool)(bVar87 & 1) * auVar107._0_4_;
            bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
            uVar153 = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * auVar107._4_4_;
            bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
            uVar154 = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * auVar107._8_4_;
            bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
            uVar155 = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * auVar107._12_4_;
            bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
            uVar156 = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * auVar107._16_4_;
            bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
            uVar157 = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * auVar107._20_4_;
            bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
            uVar158 = (uint)bVar11 * auVar115._24_4_ | (uint)!bVar11 * auVar107._24_4_;
            bVar11 = SUB81(uVar21 >> 7,0);
            uVar159 = (uint)bVar11 * auVar115._28_4_ | (uint)!bVar11 * auVar107._28_4_;
            auVar146._0_4_ = (bVar84 & 1) * uVar90 | !(bool)(bVar84 & 1) * auVar146._0_4_;
            bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar146._4_4_ = bVar11 * uVar153 | !bVar11 * auVar146._4_4_;
            bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar146._8_4_ = bVar11 * uVar154 | !bVar11 * auVar146._8_4_;
            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar146._12_4_ = bVar11 * uVar155 | !bVar11 * auVar146._12_4_;
            bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar146._16_4_ = bVar11 * uVar156 | !bVar11 * auVar146._16_4_;
            bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar146._20_4_ = bVar11 * uVar157 | !bVar11 * auVar146._20_4_;
            bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar146._24_4_ = bVar11 * uVar158 | !bVar11 * auVar146._24_4_;
            bVar11 = SUB81(uVar89 >> 7,0);
            auVar146._28_4_ = bVar11 * uVar159 | !bVar11 * auVar146._28_4_;
            auVar115 = vblendmps_avx512vl(auVar266,auVar261);
            bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
            bVar18 = SUB81(uVar21 >> 7,0);
            auVar147._0_4_ =
                 (uint)(bVar84 & 1) *
                 ((uint)(bVar87 & 1) * auVar115._0_4_ | !(bool)(bVar87 & 1) * uVar90) |
                 !(bool)(bVar84 & 1) * auVar147._0_4_;
            bVar12 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar147._4_4_ =
                 (uint)bVar12 * ((uint)bVar11 * auVar115._4_4_ | !bVar11 * uVar153) |
                 !bVar12 * auVar147._4_4_;
            bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar147._8_4_ =
                 (uint)bVar11 * ((uint)bVar13 * auVar115._8_4_ | !bVar13 * uVar154) |
                 !bVar11 * auVar147._8_4_;
            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar147._12_4_ =
                 (uint)bVar11 * ((uint)bVar14 * auVar115._12_4_ | !bVar14 * uVar155) |
                 !bVar11 * auVar147._12_4_;
            bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar147._16_4_ =
                 (uint)bVar11 * ((uint)bVar15 * auVar115._16_4_ | !bVar15 * uVar156) |
                 !bVar11 * auVar147._16_4_;
            bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar147._20_4_ =
                 (uint)bVar11 * ((uint)bVar16 * auVar115._20_4_ | !bVar16 * uVar157) |
                 !bVar11 * auVar147._20_4_;
            bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar147._24_4_ =
                 (uint)bVar11 * ((uint)bVar17 * auVar115._24_4_ | !bVar17 * uVar158) |
                 !bVar11 * auVar147._24_4_;
            bVar11 = SUB81(uVar89 >> 7,0);
            auVar147._28_4_ =
                 (uint)bVar11 * ((uint)bVar18 * auVar115._28_4_ | !bVar18 * uVar159) |
                 !bVar11 * auVar147._28_4_;
            bVar83 = (~bVar84 | bVar87) & bVar83;
          }
        }
        auVar279 = ZEXT3264(local_5e0);
        auVar254._0_4_ = local_5e0._0_4_ * auVar201._0_4_;
        auVar254._4_4_ = local_5e0._4_4_ * auVar201._4_4_;
        auVar254._8_4_ = local_5e0._8_4_ * auVar201._8_4_;
        auVar254._12_4_ = local_5e0._12_4_ * auVar201._12_4_;
        auVar254._16_4_ = local_5e0._16_4_ * auVar201._16_4_;
        auVar254._20_4_ = local_5e0._20_4_ * auVar201._20_4_;
        auVar254._28_36_ = auVar201._28_36_;
        auVar254._24_4_ = local_5e0._24_4_ * auVar201._24_4_;
        auVar267 = ZEXT3264(local_5c0);
        auVar94 = vfmadd231ps_fma(auVar254._0_32_,local_5c0,auVar117);
        auVar262 = ZEXT3264(local_5a0);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_5a0,auVar119);
        auVar274 = ZEXT3264(_local_6a0);
        _local_200 = _local_6a0;
        local_1e0 = vminps_avx(local_360,auVar146);
        auVar258._8_4_ = 0x7fffffff;
        auVar258._0_8_ = 0x7fffffff7fffffff;
        auVar258._12_4_ = 0x7fffffff;
        auVar258._16_4_ = 0x7fffffff;
        auVar258._20_4_ = 0x7fffffff;
        auVar258._24_4_ = 0x7fffffff;
        auVar258._28_4_ = 0x7fffffff;
        auVar115 = vandps_avx(ZEXT1632(auVar94),auVar258);
        local_380 = vmaxps_avx(_local_6a0,auVar147);
        auVar254 = ZEXT3264(local_380);
        auVar172._8_4_ = 0x3e99999a;
        auVar172._0_8_ = 0x3e99999a3e99999a;
        auVar172._12_4_ = 0x3e99999a;
        auVar172._16_4_ = 0x3e99999a;
        auVar172._20_4_ = 0x3e99999a;
        auVar172._24_4_ = 0x3e99999a;
        auVar172._28_4_ = 0x3e99999a;
        uVar20 = vcmpps_avx512vl(auVar115,auVar172,1);
        local_580._0_2_ = (short)uVar20;
        uVar20 = vcmpps_avx512vl(_local_6a0,local_1e0,2);
        bVar84 = (byte)uVar20 & bVar78;
        uVar22 = vcmpps_avx512vl(local_380,local_360,2);
        auVar282 = ZEXT3264(local_8e0);
        auVar283 = ZEXT3264(local_900);
        if ((bVar78 & ((byte)uVar22 | (byte)uVar20)) == 0) {
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar288 = ZEXT3264(auVar115);
        }
        else {
          auVar63._4_4_ = local_5e0._4_4_ * auVar272._4_4_;
          auVar63._0_4_ = local_5e0._0_4_ * auVar272._0_4_;
          auVar63._8_4_ = local_5e0._8_4_ * auVar272._8_4_;
          auVar63._12_4_ = local_5e0._12_4_ * auVar272._12_4_;
          auVar63._16_4_ = local_5e0._16_4_ * auVar272._16_4_;
          auVar63._20_4_ = local_5e0._20_4_ * auVar272._20_4_;
          auVar63._24_4_ = local_5e0._24_4_ * auVar272._24_4_;
          auVar63._28_4_ = 0x3e99999a;
          auVar94 = vfmadd213ps_fma(auVar120,local_5c0,auVar63);
          auVar94 = vfmadd213ps_fma(auVar116,local_5a0,ZEXT1632(auVar94));
          auVar115 = vandps_avx(ZEXT1632(auVar94),auVar258);
          uVar20 = vcmpps_avx512vl(auVar115,auVar172,1);
          bVar87 = (byte)uVar20 | ~bVar83;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar115 = vpblendmd_avx512vl(auVar173,auVar33);
          local_320._0_4_ = (uint)(bVar87 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar87 & 1) * 2;
          bVar11 = (bool)(bVar87 >> 1 & 1);
          local_320._4_4_ = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar87 >> 2 & 1);
          local_320._8_4_ = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar87 >> 3 & 1);
          local_320._12_4_ = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar87 >> 4 & 1);
          local_320._16_4_ = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar87 >> 5 & 1);
          local_320._20_4_ = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar87 >> 6 & 1);
          local_320._24_4_ = (uint)bVar11 * auVar115._24_4_ | (uint)!bVar11 * 2;
          local_320._28_4_ = (uint)(bVar87 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar87 >> 7) * 2;
          local_500 = vpbroadcastd_avx512vl();
          uVar20 = vpcmpd_avx512vl(local_500,local_320,5);
          bVar87 = (byte)uVar20 & bVar84;
          if (bVar87 == 0) {
            auVar175._4_4_ = uVar91;
            auVar175._0_4_ = uVar91;
            auVar175._8_4_ = uVar91;
            auVar175._12_4_ = uVar91;
            auVar175._16_4_ = uVar91;
            auVar175._20_4_ = uVar91;
            auVar175._24_4_ = uVar91;
            auVar175._28_4_ = uVar91;
          }
          else {
            local_340 = local_380;
            auVar100 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar94 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar2 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar95 = vminps_avx(auVar100,auVar2);
            auVar100 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar2 = vmaxps_avx(auVar94,auVar100);
            auVar203._8_4_ = 0x7fffffff;
            auVar203._0_8_ = 0x7fffffff7fffffff;
            auVar203._12_4_ = 0x7fffffff;
            auVar94 = vandps_avx(auVar95,auVar203);
            auVar100 = vandps_avx(auVar2,auVar203);
            auVar94 = vmaxps_avx(auVar94,auVar100);
            auVar100 = vmovshdup_avx(auVar94);
            auVar100 = vmaxss_avx(auVar100,auVar94);
            auVar94 = vshufpd_avx(auVar94,auVar94,1);
            auVar94 = vmaxss_avx(auVar94,auVar100);
            local_860._0_4_ = auVar94._0_4_ * 1.9073486e-06;
            local_700 = vshufps_avx(auVar2,auVar2,0xff);
            local_560 = (float)local_6a0._0_4_ + (float)local_800._0_4_;
            fStack_55c = (float)local_6a0._4_4_ + (float)local_800._4_4_;
            fStack_558 = fStack_698 + fStack_7f8;
            fStack_554 = fStack_694 + fStack_7f4;
            fStack_550 = fStack_690 + fStack_7f0;
            fStack_54c = fStack_68c + fStack_7ec;
            fStack_548 = fStack_688 + fStack_7e8;
            fStack_544 = fStack_684 + fStack_7e4;
            do {
              auVar174._8_4_ = 0x7f800000;
              auVar174._0_8_ = 0x7f8000007f800000;
              auVar174._12_4_ = 0x7f800000;
              auVar174._16_4_ = 0x7f800000;
              auVar174._20_4_ = 0x7f800000;
              auVar174._24_4_ = 0x7f800000;
              auVar174._28_4_ = 0x7f800000;
              auVar115 = vblendmps_avx512vl(auVar174,_local_6a0);
              auVar148._0_4_ =
                   (uint)(bVar87 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar87 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar87 >> 1 & 1);
              auVar148._4_4_ = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar87 >> 2 & 1);
              auVar148._8_4_ = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar87 >> 3 & 1);
              auVar148._12_4_ = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar87 >> 4 & 1);
              auVar148._16_4_ = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar87 >> 5 & 1);
              auVar148._20_4_ = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * 0x7f800000;
              auVar148._24_4_ =
                   (uint)(bVar87 >> 6) * auVar115._24_4_ | (uint)!(bool)(bVar87 >> 6) * 0x7f800000;
              auVar148._28_4_ = 0x7f800000;
              auVar115 = vshufps_avx(auVar148,auVar148,0xb1);
              auVar115 = vminps_avx(auVar148,auVar115);
              auVar116 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar116);
              auVar116 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar116);
              uVar20 = vcmpps_avx512vl(auVar148,auVar115,0);
              bVar79 = (byte)uVar20 & bVar87;
              bVar80 = bVar87;
              if (bVar79 != 0) {
                bVar80 = bVar79;
              }
              iVar24 = 0;
              for (uVar91 = (uint)bVar80; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar91 = *(uint *)(local_200 + (uint)(iVar24 << 2));
              fVar263 = auVar19._0_4_;
              auVar94 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar24 << 2)));
              if ((float)local_820._0_4_ < 0.0) {
                local_880._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar24 << 2)));
                fVar263 = sqrtf((float)local_820._0_4_);
                auVar94 = local_880._0_16_;
              }
              auVar94 = vinsertps_avx(ZEXT416(uVar91),auVar94,0x10);
              auVar271 = ZEXT1664(auVar94);
              lVar88 = 5;
              do {
                uVar185 = auVar271._0_4_;
                auVar162._4_4_ = uVar185;
                auVar162._0_4_ = uVar185;
                auVar162._8_4_ = uVar185;
                auVar162._12_4_ = uVar185;
                auVar94 = vfmadd132ps_fma(auVar162,ZEXT816(0) << 0x40,local_810);
                local_760 = auVar271._0_32_;
                auVar100 = vmovshdup_avx(auVar271._0_16_);
                fVar240 = auVar100._0_4_;
                fVar239 = 1.0 - fVar240;
                fVar270 = fVar239 * fVar239 * fVar239;
                fVar268 = fVar240 * fVar240;
                fVar241 = fVar268 * fVar240;
                auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar270),
                                         ZEXT416((uint)fVar241));
                fVar269 = fVar240 * fVar239;
                local_880._0_16_ = ZEXT416((uint)fVar239);
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar269 * fVar240 * 6.0)),
                                           ZEXT416((uint)(fVar269 * fVar239)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar241),
                                          ZEXT416((uint)fVar270));
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar269 * fVar239 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar269 * fVar240)));
                fVar270 = fVar270 * 0.16666667;
                fVar239 = (auVar2._0_4_ + auVar101._0_4_) * 0.16666667;
                fVar240 = (auVar95._0_4_ + auVar93._0_4_) * 0.16666667;
                fVar241 = fVar241 * 0.16666667;
                auVar204._0_4_ = fVar241 * (float)local_7e0._0_4_;
                auVar204._4_4_ = fVar241 * (float)local_7e0._4_4_;
                auVar204._8_4_ = fVar241 * fStack_7d8;
                auVar204._12_4_ = fVar241 * fStack_7d4;
                auVar242._4_4_ = fVar240;
                auVar242._0_4_ = fVar240;
                auVar242._8_4_ = fVar240;
                auVar242._12_4_ = fVar240;
                auVar2 = vfmadd132ps_fma(auVar242,auVar204,local_7a0._0_16_);
                auVar205._4_4_ = fVar239;
                auVar205._0_4_ = fVar239;
                auVar205._8_4_ = fVar239;
                auVar205._12_4_ = fVar239;
                auVar2 = vfmadd132ps_fma(auVar205,auVar2,local_7c0._0_16_);
                auVar186._4_4_ = fVar270;
                auVar186._0_4_ = fVar270;
                auVar186._8_4_ = fVar270;
                auVar186._12_4_ = fVar270;
                auVar2 = vfmadd132ps_fma(auVar186,auVar2,local_780._0_16_);
                local_600._0_16_ = auVar2;
                auVar2 = vsubps_avx(auVar94,auVar2);
                auVar94 = vdpps_avx(auVar2,auVar2,0x7f);
                local_840._0_16_ = auVar94;
                if (auVar94._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar268;
                  local_8c0._0_4_ = fVar269;
                  auVar262._0_4_ = sqrtf(auVar94._0_4_);
                  auVar262._4_60_ = extraout_var;
                  auVar94 = auVar262._0_16_;
                  fVar269 = (float)local_8c0._0_4_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  local_8a0._0_4_ = fVar268;
                }
                local_620._4_4_ = local_880._0_4_;
                local_620._0_4_ = local_620._4_4_;
                fStack_618 = (float)local_620._4_4_;
                fStack_614 = (float)local_620._4_4_;
                auVar101 = vfnmsub213ss_fma(auVar100,auVar100,ZEXT416((uint)(fVar269 * 4.0)));
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar269 * 4.0)),local_880._0_16_,
                                          local_880._0_16_);
                fVar268 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
                fVar269 = auVar101._0_4_ * 0.5;
                fVar270 = auVar95._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar224._0_4_ = (float)local_8a0._0_4_ * (float)local_7e0._0_4_;
                auVar224._4_4_ = (float)local_8a0._0_4_ * (float)local_7e0._4_4_;
                auVar224._8_4_ = (float)local_8a0._0_4_ * fStack_7d8;
                auVar224._12_4_ = (float)local_8a0._0_4_ * fStack_7d4;
                auVar187._4_4_ = fVar270;
                auVar187._0_4_ = fVar270;
                auVar187._8_4_ = fVar270;
                auVar187._12_4_ = fVar270;
                auVar95 = vfmadd132ps_fma(auVar187,auVar224,local_7a0._0_16_);
                auVar206._4_4_ = fVar269;
                auVar206._0_4_ = fVar269;
                auVar206._8_4_ = fVar269;
                auVar206._12_4_ = fVar269;
                auVar95 = vfmadd132ps_fma(auVar206,auVar95,local_7c0._0_16_);
                auVar276._4_4_ = fVar268;
                auVar276._0_4_ = fVar268;
                auVar276._8_4_ = fVar268;
                auVar276._12_4_ = fVar268;
                _local_8a0 = vfmadd132ps_fma(auVar276,auVar95,local_780._0_16_);
                local_640._0_16_ = vdpps_avx(_local_8a0,_local_8a0,0x7f);
                auVar65._12_4_ = 0;
                auVar65._0_12_ = ZEXT812(0);
                fVar268 = local_640._0_4_;
                auVar95 = vrsqrt14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar268));
                fVar269 = auVar95._0_4_;
                local_660._0_16_ = vrcp14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar268));
                auVar95 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
                local_680._0_4_ = auVar95._0_4_;
                local_8c0._0_4_ = auVar94._0_4_;
                if (fVar268 < -fVar268) {
                  fVar270 = sqrtf(fVar268);
                  auVar94 = ZEXT416((uint)local_8c0._0_4_);
                  auVar95 = _local_8a0;
                }
                else {
                  auVar95 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                  fVar270 = auVar95._0_4_;
                  auVar95 = _local_8a0;
                }
                fVar268 = fVar269 * 1.5 + fVar268 * -0.5 * fVar269 * fVar269 * fVar269;
                auVar163._0_4_ = auVar95._0_4_ * fVar268;
                auVar163._4_4_ = auVar95._4_4_ * fVar268;
                auVar163._8_4_ = auVar95._8_4_ * fVar268;
                auVar163._12_4_ = auVar95._12_4_ * fVar268;
                auVar101 = vdpps_avx(auVar2,auVar163,0x7f);
                fVar240 = auVar94._0_4_;
                fVar269 = auVar101._0_4_;
                auVar164._0_4_ = fVar269 * fVar269;
                auVar164._4_4_ = auVar101._4_4_ * auVar101._4_4_;
                auVar164._8_4_ = auVar101._8_4_ * auVar101._8_4_;
                auVar164._12_4_ = auVar101._12_4_ * auVar101._12_4_;
                auVar93 = vsubps_avx(local_840._0_16_,auVar164);
                fVar239 = auVar93._0_4_;
                auVar188._4_12_ = ZEXT812(0) << 0x20;
                auVar188._0_4_ = fVar239;
                auVar96 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
                auVar97 = vmulss_avx512f(auVar96,ZEXT416(0x3fc00000));
                auVar98 = vmulss_avx512f(auVar93,ZEXT416(0xbf000000));
                if (fVar239 < 0.0) {
                  local_6c0._0_4_ = fVar270;
                  local_6e0._0_4_ = auVar97._0_4_;
                  local_6f0._4_4_ = fVar268;
                  local_6f0._0_4_ = fVar268;
                  fStack_6e8 = fVar268;
                  fStack_6e4 = fVar268;
                  local_6d0 = auVar96;
                  fVar239 = sqrtf(fVar239);
                  auVar98 = ZEXT416(auVar98._0_4_);
                  auVar97 = ZEXT416((uint)local_6e0._0_4_);
                  auVar94 = ZEXT416((uint)local_8c0._0_4_);
                  auVar96 = local_6d0;
                  auVar95 = _local_8a0;
                  fVar268 = (float)local_6f0._0_4_;
                  fVar241 = (float)local_6f0._4_4_;
                  fVar183 = fStack_6e8;
                  fVar223 = fStack_6e4;
                  fVar270 = (float)local_6c0._0_4_;
                }
                else {
                  auVar93 = vsqrtss_avx(auVar93,auVar93);
                  fVar239 = auVar93._0_4_;
                  fVar241 = fVar268;
                  fVar183 = fVar268;
                  fVar223 = fVar268;
                }
                auVar279 = ZEXT1664(auVar95);
                auVar274 = ZEXT1664(local_840._0_16_);
                auVar272 = ZEXT1664(auVar2);
                auVar282 = ZEXT3264(local_8e0);
                auVar283 = ZEXT3264(local_900);
                auVar284 = ZEXT3264(local_920);
                auVar285 = ZEXT3264(local_940);
                auVar286 = ZEXT3264(local_960);
                auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,auVar100);
                auVar102 = vfmadd213ss_fma(auVar100,SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_)
                ;
                auVar104 = local_760._0_16_;
                auVar100 = vshufps_avx(auVar104,auVar104,0x55);
                auVar207._0_4_ = auVar100._0_4_ * (float)local_7e0._0_4_;
                auVar207._4_4_ = auVar100._4_4_ * (float)local_7e0._4_4_;
                auVar207._8_4_ = auVar100._8_4_ * fStack_7d8;
                auVar207._12_4_ = auVar100._12_4_ * fStack_7d4;
                auVar225._0_4_ = auVar102._0_4_;
                auVar225._4_4_ = auVar225._0_4_;
                auVar225._8_4_ = auVar225._0_4_;
                auVar225._12_4_ = auVar225._0_4_;
                auVar100 = vfmadd132ps_fma(auVar225,auVar207,local_7a0._0_16_);
                auVar189._0_4_ = auVar93._0_4_;
                auVar189._4_4_ = auVar189._0_4_;
                auVar189._8_4_ = auVar189._0_4_;
                auVar189._12_4_ = auVar189._0_4_;
                auVar100 = vfmadd132ps_fma(auVar189,auVar100,local_7c0._0_16_);
                auVar100 = vfmadd132ps_fma(_local_620,auVar100,local_780._0_16_);
                auVar190._0_4_ = auVar100._0_4_ * (float)local_640._0_4_;
                auVar190._4_4_ = auVar100._4_4_ * (float)local_640._0_4_;
                auVar190._8_4_ = auVar100._8_4_ * (float)local_640._0_4_;
                auVar190._12_4_ = auVar100._12_4_ * (float)local_640._0_4_;
                auVar100 = vdpps_avx(auVar95,auVar100,0x7f);
                fVar248 = auVar100._0_4_;
                auVar208._0_4_ = auVar95._0_4_ * fVar248;
                auVar208._4_4_ = auVar95._4_4_ * fVar248;
                auVar208._8_4_ = auVar95._8_4_ * fVar248;
                auVar208._12_4_ = auVar95._12_4_ * fVar248;
                auVar100 = vsubps_avx(auVar190,auVar208);
                fVar248 = (float)local_680._0_4_ * (float)local_660._0_4_;
                auVar102 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                      ZEXT416((uint)(local_760._0_4_ * fVar263 * 1.9073486e-06)));
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar99 = vxorps_avx512vl(auVar95,auVar25);
                auVar209._0_4_ = fVar268 * auVar100._0_4_ * fVar248;
                auVar209._4_4_ = fVar241 * auVar100._4_4_ * fVar248;
                auVar209._8_4_ = fVar183 * auVar100._8_4_ * fVar248;
                auVar209._12_4_ = fVar223 * auVar100._12_4_ * fVar248;
                auVar100 = vdpps_avx(auVar99,auVar163,0x7f);
                auVar93 = vfmadd213ss_fma(auVar94,ZEXT416((uint)local_860._0_4_),auVar102);
                auVar94 = vdpps_avx(auVar2,auVar209,0x7f);
                auVar103 = vfmadd213ss_fma(ZEXT416((uint)(fVar240 + 1.0)),
                                           ZEXT416((uint)((float)local_860._0_4_ / fVar270)),auVar93
                                          );
                fVar268 = auVar100._0_4_ + auVar94._0_4_;
                auVar94 = vdpps_avx(local_810,auVar163,0x7f);
                auVar100 = vdpps_avx(auVar2,auVar99,0x7f);
                auVar93 = vmulss_avx512f(auVar98,auVar96);
                auVar98 = vaddss_avx512f(auVar97,ZEXT416((uint)(auVar93._0_4_ *
                                                               auVar96._0_4_ * auVar96._0_4_)));
                auVar93 = vdpps_avx(auVar2,local_810,0x7f);
                auVar97 = vfnmadd231ss_fma(auVar100,auVar101,ZEXT416((uint)fVar268));
                auVar93 = vfnmadd231ss_fma(auVar93,auVar101,auVar94);
                auVar100 = vpermilps_avx(local_600._0_16_,0xff);
                fVar239 = fVar239 - auVar100._0_4_;
                auVar96 = vshufps_avx(auVar95,auVar95,0xff);
                auVar100 = vfmsub213ss_fma(auVar97,auVar98,auVar96);
                auVar264._8_4_ = 0x80000000;
                auVar264._0_8_ = 0x8000000080000000;
                auVar264._12_4_ = 0x80000000;
                auVar267 = ZEXT1664(auVar264);
                auVar259._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
                auVar259._8_4_ = auVar100._8_4_ ^ 0x80000000;
                auVar259._12_4_ = auVar100._12_4_ ^ 0x80000000;
                auVar262 = ZEXT1664(auVar259);
                auVar93 = ZEXT416((uint)(auVar93._0_4_ * auVar98._0_4_));
                auVar97 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar100._0_4_)),
                                          ZEXT416((uint)fVar268),auVar93);
                auVar100 = vinsertps_avx(auVar259,auVar93,0x1c);
                auVar252._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
                auVar252._8_4_ = auVar94._8_4_ ^ 0x80000000;
                auVar252._12_4_ = auVar94._12_4_ ^ 0x80000000;
                auVar93 = vinsertps_avx(ZEXT416((uint)fVar268),auVar252,0x10);
                auVar226._0_4_ = auVar97._0_4_;
                auVar226._4_4_ = auVar226._0_4_;
                auVar226._8_4_ = auVar226._0_4_;
                auVar226._12_4_ = auVar226._0_4_;
                auVar94 = vdivps_avx(auVar100,auVar226);
                auVar100 = vdivps_avx(auVar93,auVar226);
                auVar227._0_4_ = fVar269 * auVar94._0_4_ + fVar239 * auVar100._0_4_;
                auVar227._4_4_ = fVar269 * auVar94._4_4_ + fVar239 * auVar100._4_4_;
                auVar227._8_4_ = fVar269 * auVar94._8_4_ + fVar239 * auVar100._8_4_;
                auVar227._12_4_ = fVar269 * auVar94._12_4_ + fVar239 * auVar100._12_4_;
                auVar94 = vsubps_avx(auVar104,auVar227);
                auVar271 = ZEXT1664(auVar94);
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar100 = vandps_avx512vl(auVar101,auVar26);
                if (auVar100._0_4_ < auVar103._0_4_) {
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar103._0_4_ + auVar102._0_4_)),
                                             local_700,ZEXT416(0x36000000));
                  auVar27._8_4_ = 0x7fffffff;
                  auVar27._0_8_ = 0x7fffffff7fffffff;
                  auVar27._12_4_ = 0x7fffffff;
                  auVar101 = vandps_avx512vl(ZEXT416((uint)fVar239),auVar27);
                  if (auVar101._0_4_ < auVar100._0_4_) {
                    fVar263 = auVar94._0_4_ + (float)local_710._0_4_;
                    if ((fVar263 < fVar160) ||
                       (fVar268 = *(float *)(ray + k * 4 + 0x100), fVar268 < fVar263)) break;
                    auVar100 = vmovshdup_avx(auVar94);
                    fVar269 = auVar100._0_4_;
                    if ((fVar269 < 0.0) || (1.0 < fVar269)) break;
                    auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_840._0_4_))
                    ;
                    fVar270 = auVar100._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar81].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar270 = fVar270 * 1.5 + local_840._0_4_ * -0.5 * fVar270 * fVar270 * fVar270;
                    auVar228._0_4_ = auVar2._0_4_ * fVar270;
                    auVar228._4_4_ = auVar2._4_4_ * fVar270;
                    auVar228._8_4_ = auVar2._8_4_ * fVar270;
                    auVar228._12_4_ = auVar2._12_4_ * fVar270;
                    auVar96 = vfmadd213ps_fma(auVar96,auVar228,auVar95);
                    auVar100 = vshufps_avx(auVar228,auVar228,0xc9);
                    auVar101 = vshufps_avx(auVar95,auVar95,0xc9);
                    auVar229._0_4_ = auVar228._0_4_ * auVar101._0_4_;
                    auVar229._4_4_ = auVar228._4_4_ * auVar101._4_4_;
                    auVar229._8_4_ = auVar228._8_4_ * auVar101._8_4_;
                    auVar229._12_4_ = auVar228._12_4_ * auVar101._12_4_;
                    auVar93 = vfmsub231ps_fma(auVar229,auVar95,auVar100);
                    auVar100 = vshufps_avx(auVar93,auVar93,0xc9);
                    auVar101 = vshufps_avx(auVar96,auVar96,0xc9);
                    auVar93 = vshufps_avx(auVar93,auVar93,0xd2);
                    auVar165._0_4_ = auVar96._0_4_ * auVar93._0_4_;
                    auVar165._4_4_ = auVar96._4_4_ * auVar93._4_4_;
                    auVar165._8_4_ = auVar96._8_4_ * auVar93._8_4_;
                    auVar165._12_4_ = auVar96._12_4_ * auVar93._12_4_;
                    auVar100 = vfmsub231ps_fma(auVar165,auVar100,auVar101);
                    uVar185 = auVar100._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar263;
                      uVar4 = vextractps_avx(auVar100,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                      uVar4 = vextractps_avx(auVar100,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar185;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar269;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_848;
                      *(uint *)(ray + k * 4 + 0x240) = uVar81;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar9 = context->user;
                    auVar237._8_4_ = 1;
                    auVar237._0_8_ = 0x100000001;
                    auVar237._12_4_ = 1;
                    auVar237._16_4_ = 1;
                    auVar237._20_4_ = 1;
                    auVar237._24_4_ = 1;
                    auVar237._28_4_ = 1;
                    local_440 = vpermps_avx2(auVar237,ZEXT1632(auVar94));
                    auVar115 = vpermps_avx2(auVar237,ZEXT1632(auVar100));
                    auVar246._8_4_ = 2;
                    auVar246._0_8_ = 0x200000002;
                    auVar246._12_4_ = 2;
                    auVar246._16_4_ = 2;
                    auVar246._20_4_ = 2;
                    auVar246._24_4_ = 2;
                    auVar246._28_4_ = 2;
                    local_480 = vpermps_avx2(auVar246,ZEXT1632(auVar100));
                    local_4a0[0] = (RTCHitN)auVar115[0];
                    local_4a0[1] = (RTCHitN)auVar115[1];
                    local_4a0[2] = (RTCHitN)auVar115[2];
                    local_4a0[3] = (RTCHitN)auVar115[3];
                    local_4a0[4] = (RTCHitN)auVar115[4];
                    local_4a0[5] = (RTCHitN)auVar115[5];
                    local_4a0[6] = (RTCHitN)auVar115[6];
                    local_4a0[7] = (RTCHitN)auVar115[7];
                    local_4a0[8] = (RTCHitN)auVar115[8];
                    local_4a0[9] = (RTCHitN)auVar115[9];
                    local_4a0[10] = (RTCHitN)auVar115[10];
                    local_4a0[0xb] = (RTCHitN)auVar115[0xb];
                    local_4a0[0xc] = (RTCHitN)auVar115[0xc];
                    local_4a0[0xd] = (RTCHitN)auVar115[0xd];
                    local_4a0[0xe] = (RTCHitN)auVar115[0xe];
                    local_4a0[0xf] = (RTCHitN)auVar115[0xf];
                    local_4a0[0x10] = (RTCHitN)auVar115[0x10];
                    local_4a0[0x11] = (RTCHitN)auVar115[0x11];
                    local_4a0[0x12] = (RTCHitN)auVar115[0x12];
                    local_4a0[0x13] = (RTCHitN)auVar115[0x13];
                    local_4a0[0x14] = (RTCHitN)auVar115[0x14];
                    local_4a0[0x15] = (RTCHitN)auVar115[0x15];
                    local_4a0[0x16] = (RTCHitN)auVar115[0x16];
                    local_4a0[0x17] = (RTCHitN)auVar115[0x17];
                    local_4a0[0x18] = (RTCHitN)auVar115[0x18];
                    local_4a0[0x19] = (RTCHitN)auVar115[0x19];
                    local_4a0[0x1a] = (RTCHitN)auVar115[0x1a];
                    local_4a0[0x1b] = (RTCHitN)auVar115[0x1b];
                    local_4a0[0x1c] = (RTCHitN)auVar115[0x1c];
                    local_4a0[0x1d] = (RTCHitN)auVar115[0x1d];
                    local_4a0[0x1e] = (RTCHitN)auVar115[0x1e];
                    local_4a0[0x1f] = (RTCHitN)auVar115[0x1f];
                    local_460 = uVar185;
                    uStack_45c = uVar185;
                    uStack_458 = uVar185;
                    uStack_454 = uVar185;
                    uStack_450 = uVar185;
                    uStack_44c = uVar185;
                    uStack_448 = uVar185;
                    uStack_444 = uVar185;
                    local_420 = ZEXT432(0) << 0x20;
                    local_400 = local_4e0._0_8_;
                    uStack_3f8 = local_4e0._8_8_;
                    uStack_3f0 = local_4e0._16_8_;
                    uStack_3e8 = local_4e0._24_8_;
                    local_3e0 = local_4c0;
                    auVar115 = vpcmpeqd_avx2(local_4c0,local_4c0);
                    local_850[1] = auVar115;
                    *local_850 = auVar115;
                    local_3c0 = pRVar9->instID[0];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    local_3a0 = pRVar9->instPrimID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar263;
                    local_740 = local_520;
                    local_990.valid = (int *)local_740;
                    local_990.geometryUserPtr = pGVar5->userPtr;
                    local_990.context = context->user;
                    local_990.hit = local_4a0;
                    local_990.N = 8;
                    local_990.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar262 = ZEXT1664(auVar259);
                      auVar267 = ZEXT1664(auVar264);
                      auVar271 = ZEXT1664(auVar94);
                      auVar272 = ZEXT1664(auVar2);
                      auVar274 = ZEXT1664(local_840._0_16_);
                      auVar279 = ZEXT1664(auVar95);
                      (*pGVar5->intersectionFilterN)(&local_990);
                      auVar286 = ZEXT3264(local_960);
                      auVar285 = ZEXT3264(local_940);
                      auVar284 = ZEXT3264(local_920);
                      auVar283 = ZEXT3264(local_900);
                      auVar282 = ZEXT3264(local_8e0);
                    }
                    if (local_740 != (undefined1  [32])0x0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar272 = ZEXT1664(auVar272._0_16_);
                        auVar274 = ZEXT1664(auVar274._0_16_);
                        auVar279 = ZEXT1664(auVar279._0_16_);
                        (*p_Var10)(&local_990);
                        auVar286 = ZEXT3264(local_960);
                        auVar285 = ZEXT3264(local_940);
                        auVar284 = ZEXT3264(local_920);
                        auVar283 = ZEXT3264(local_900);
                        auVar282 = ZEXT3264(local_8e0);
                      }
                      if (local_740 != (undefined1  [32])0x0) {
                        uVar89 = vptestmd_avx512vl(local_740,local_740);
                        iVar67 = *(int *)(local_990.hit + 4);
                        iVar68 = *(int *)(local_990.hit + 8);
                        iVar69 = *(int *)(local_990.hit + 0xc);
                        iVar70 = *(int *)(local_990.hit + 0x10);
                        iVar71 = *(int *)(local_990.hit + 0x14);
                        iVar72 = *(int *)(local_990.hit + 0x18);
                        iVar73 = *(int *)(local_990.hit + 0x1c);
                        bVar80 = (byte)uVar89;
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x180) =
                             (uint)(bVar80 & 1) * *(int *)local_990.hit |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x180);
                        *(uint *)(local_990.ray + 0x184) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x184)
                        ;
                        *(uint *)(local_990.ray + 0x188) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x188)
                        ;
                        *(uint *)(local_990.ray + 0x18c) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x18c)
                        ;
                        *(uint *)(local_990.ray + 400) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 400);
                        *(uint *)(local_990.ray + 0x194) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 0x194)
                        ;
                        *(uint *)(local_990.ray + 0x198) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x198)
                        ;
                        *(uint *)(local_990.ray + 0x19c) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x19c)
                        ;
                        iVar67 = *(int *)(local_990.hit + 0x24);
                        iVar68 = *(int *)(local_990.hit + 0x28);
                        iVar69 = *(int *)(local_990.hit + 0x2c);
                        iVar70 = *(int *)(local_990.hit + 0x30);
                        iVar71 = *(int *)(local_990.hit + 0x34);
                        iVar72 = *(int *)(local_990.hit + 0x38);
                        iVar73 = *(int *)(local_990.hit + 0x3c);
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x1a0) =
                             (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x20) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x1a0);
                        *(uint *)(local_990.ray + 0x1a4) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1a4)
                        ;
                        *(uint *)(local_990.ray + 0x1a8) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1a8)
                        ;
                        *(uint *)(local_990.ray + 0x1ac) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1ac)
                        ;
                        *(uint *)(local_990.ray + 0x1b0) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 0x1b0)
                        ;
                        *(uint *)(local_990.ray + 0x1b4) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 0x1b4)
                        ;
                        *(uint *)(local_990.ray + 0x1b8) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x1b8)
                        ;
                        *(uint *)(local_990.ray + 0x1bc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x1bc)
                        ;
                        iVar67 = *(int *)(local_990.hit + 0x44);
                        iVar68 = *(int *)(local_990.hit + 0x48);
                        iVar69 = *(int *)(local_990.hit + 0x4c);
                        iVar70 = *(int *)(local_990.hit + 0x50);
                        iVar71 = *(int *)(local_990.hit + 0x54);
                        iVar72 = *(int *)(local_990.hit + 0x58);
                        iVar73 = *(int *)(local_990.hit + 0x5c);
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x1c0) =
                             (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x40) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x1c0);
                        *(uint *)(local_990.ray + 0x1c4) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1c4)
                        ;
                        *(uint *)(local_990.ray + 0x1c8) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1c8)
                        ;
                        *(uint *)(local_990.ray + 0x1cc) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1cc)
                        ;
                        *(uint *)(local_990.ray + 0x1d0) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 0x1d0)
                        ;
                        *(uint *)(local_990.ray + 0x1d4) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 0x1d4)
                        ;
                        *(uint *)(local_990.ray + 0x1d8) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x1d8)
                        ;
                        *(uint *)(local_990.ray + 0x1dc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x1dc)
                        ;
                        iVar67 = *(int *)(local_990.hit + 100);
                        iVar68 = *(int *)(local_990.hit + 0x68);
                        iVar69 = *(int *)(local_990.hit + 0x6c);
                        iVar70 = *(int *)(local_990.hit + 0x70);
                        iVar71 = *(int *)(local_990.hit + 0x74);
                        iVar72 = *(int *)(local_990.hit + 0x78);
                        iVar73 = *(int *)(local_990.hit + 0x7c);
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x1e0) =
                             (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x60) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x1e0);
                        *(uint *)(local_990.ray + 0x1e4) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1e4)
                        ;
                        *(uint *)(local_990.ray + 0x1e8) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1e8)
                        ;
                        *(uint *)(local_990.ray + 0x1ec) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1ec)
                        ;
                        *(uint *)(local_990.ray + 0x1f0) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 0x1f0)
                        ;
                        *(uint *)(local_990.ray + 500) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 500);
                        *(uint *)(local_990.ray + 0x1f8) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x1f8)
                        ;
                        *(uint *)(local_990.ray + 0x1fc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x1fc)
                        ;
                        iVar67 = *(int *)(local_990.hit + 0x84);
                        iVar68 = *(int *)(local_990.hit + 0x88);
                        iVar69 = *(int *)(local_990.hit + 0x8c);
                        iVar70 = *(int *)(local_990.hit + 0x90);
                        iVar71 = *(int *)(local_990.hit + 0x94);
                        iVar72 = *(int *)(local_990.hit + 0x98);
                        iVar73 = *(int *)(local_990.hit + 0x9c);
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x200) =
                             (uint)(bVar80 & 1) * *(int *)(local_990.hit + 0x80) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_990.ray + 0x200);
                        *(uint *)(local_990.ray + 0x204) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x204)
                        ;
                        *(uint *)(local_990.ray + 0x208) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x208)
                        ;
                        *(uint *)(local_990.ray + 0x20c) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x20c)
                        ;
                        *(uint *)(local_990.ray + 0x210) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 0x210)
                        ;
                        *(uint *)(local_990.ray + 0x214) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 0x214)
                        ;
                        *(uint *)(local_990.ray + 0x218) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x218)
                        ;
                        *(uint *)(local_990.ray + 0x21c) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x21c)
                        ;
                        auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xa0));
                        *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar115;
                        auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xc0));
                        *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar115;
                        auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xe0));
                        *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar115;
                        auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar115;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar268;
                    break;
                  }
                }
                lVar88 = lVar88 + -1;
              } while (lVar88 != 0);
              uVar185 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar175._4_4_ = uVar185;
              auVar175._0_4_ = uVar185;
              auVar175._8_4_ = uVar185;
              auVar175._12_4_ = uVar185;
              auVar175._16_4_ = uVar185;
              auVar175._20_4_ = uVar185;
              auVar175._24_4_ = uVar185;
              auVar175._28_4_ = uVar185;
              auVar74._4_4_ = fStack_55c;
              auVar74._0_4_ = local_560;
              auVar74._8_4_ = fStack_558;
              auVar74._12_4_ = fStack_554;
              auVar74._16_4_ = fStack_550;
              auVar74._20_4_ = fStack_54c;
              auVar74._24_4_ = fStack_548;
              auVar74._28_4_ = fStack_544;
              uVar20 = vcmpps_avx512vl(auVar175,auVar74,0xd);
              bVar87 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar87 & (byte)uVar20;
            } while (bVar87 != 0);
            auVar254 = ZEXT3264(local_340);
          }
          bVar83 = local_580[0] | ~bVar83;
          auVar197._0_4_ = (float)local_800._0_4_ + auVar254._0_4_;
          auVar197._4_4_ = (float)local_800._4_4_ + auVar254._4_4_;
          auVar197._8_4_ = fStack_7f8 + auVar254._8_4_;
          auVar197._12_4_ = fStack_7f4 + auVar254._12_4_;
          auVar197._16_4_ = fStack_7f0 + auVar254._16_4_;
          auVar197._20_4_ = fStack_7ec + auVar254._20_4_;
          auVar197._24_4_ = fStack_7e8 + auVar254._24_4_;
          auVar197._28_4_ = fStack_7e4 + auVar254._28_4_;
          uVar20 = vcmpps_avx512vl(auVar197,auVar175,2);
          bVar78 = (byte)uVar22 & bVar78 & (byte)uVar20;
          auVar198._8_4_ = 2;
          auVar198._0_8_ = 0x200000002;
          auVar198._12_4_ = 2;
          auVar198._16_4_ = 2;
          auVar198._20_4_ = 2;
          auVar198._24_4_ = 2;
          auVar198._28_4_ = 2;
          auVar34._8_4_ = 3;
          auVar34._0_8_ = 0x300000003;
          auVar34._12_4_ = 3;
          auVar34._16_4_ = 3;
          auVar34._20_4_ = 3;
          auVar34._24_4_ = 3;
          auVar34._28_4_ = 3;
          auVar115 = vpblendmd_avx512vl(auVar198,auVar34);
          auVar149._0_4_ = (uint)(bVar83 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar83 & 1) * 2;
          bVar11 = (bool)(bVar83 >> 1 & 1);
          auVar149._4_4_ = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar83 >> 2 & 1);
          auVar149._8_4_ = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar83 >> 3 & 1);
          auVar149._12_4_ = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar83 >> 4 & 1);
          auVar149._16_4_ = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar83 >> 5 & 1);
          auVar149._20_4_ = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar83 >> 6 & 1);
          auVar149._24_4_ = (uint)bVar11 * auVar115._24_4_ | (uint)!bVar11 * 2;
          auVar149._28_4_ = (uint)(bVar83 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar83 >> 7) * 2;
          uVar20 = vpcmpd_avx512vl(local_500,auVar149,5);
          bVar83 = (byte)uVar20 & bVar78;
          fVar263 = (float)local_800._0_4_;
          fVar268 = (float)local_800._4_4_;
          fVar269 = fStack_7f8;
          fVar270 = fStack_7f4;
          fVar239 = fStack_7f0;
          fVar240 = fStack_7ec;
          fVar241 = fStack_7e8;
          fVar183 = fStack_7e4;
          if (bVar83 != 0) {
            auVar100 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar94 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar2 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar95 = vminps_avx(auVar100,auVar2);
            auVar100 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar2 = vmaxps_avx(auVar94,auVar100);
            auVar210._8_4_ = 0x7fffffff;
            auVar210._0_8_ = 0x7fffffff7fffffff;
            auVar210._12_4_ = 0x7fffffff;
            auVar94 = vandps_avx(auVar95,auVar210);
            auVar100 = vandps_avx(auVar2,auVar210);
            auVar94 = vmaxps_avx(auVar94,auVar100);
            auVar100 = vmovshdup_avx(auVar94);
            auVar100 = vmaxss_avx(auVar100,auVar94);
            auVar94 = vshufpd_avx(auVar94,auVar94,1);
            auVar94 = vmaxss_avx(auVar94,auVar100);
            fVar263 = auVar94._0_4_ * 1.9073486e-06;
            local_700 = vshufps_avx(auVar2,auVar2,0xff);
            local_560 = (float)local_800._0_4_ + local_380._0_4_;
            fStack_55c = (float)local_800._4_4_ + local_380._4_4_;
            fStack_558 = fStack_7f8 + local_380._8_4_;
            fStack_554 = fStack_7f4 + local_380._12_4_;
            fStack_550 = fStack_7f0 + local_380._16_4_;
            fStack_54c = fStack_7ec + local_380._20_4_;
            fStack_548 = fStack_7e8 + local_380._24_4_;
            fStack_544 = fStack_7e4 + local_380._28_4_;
            _local_6a0 = local_380;
            local_580 = auVar149;
            do {
              auVar176._8_4_ = 0x7f800000;
              auVar176._0_8_ = 0x7f8000007f800000;
              auVar176._12_4_ = 0x7f800000;
              auVar176._16_4_ = 0x7f800000;
              auVar176._20_4_ = 0x7f800000;
              auVar176._24_4_ = 0x7f800000;
              auVar176._28_4_ = 0x7f800000;
              auVar115 = vblendmps_avx512vl(auVar176,_local_6a0);
              auVar150._0_4_ =
                   (uint)(bVar83 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar83 >> 1 & 1);
              auVar150._4_4_ = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar83 >> 2 & 1);
              auVar150._8_4_ = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar83 >> 3 & 1);
              auVar150._12_4_ = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar83 >> 4 & 1);
              auVar150._16_4_ = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar83 >> 5 & 1);
              auVar150._20_4_ = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * 0x7f800000;
              auVar150._24_4_ =
                   (uint)(bVar83 >> 6) * auVar115._24_4_ | (uint)!(bool)(bVar83 >> 6) * 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar115 = vshufps_avx(auVar150,auVar150,0xb1);
              auVar115 = vminps_avx(auVar150,auVar115);
              auVar116 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar116);
              auVar116 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar116);
              uVar20 = vcmpps_avx512vl(auVar150,auVar115,0);
              bVar80 = (byte)uVar20 & bVar83;
              bVar87 = bVar83;
              if (bVar80 != 0) {
                bVar87 = bVar80;
              }
              iVar24 = 0;
              for (uVar91 = (uint)bVar87; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar91 = *(uint *)(local_360 + (uint)(iVar24 << 2));
              fVar268 = auVar92._0_4_;
              auVar94 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar24 << 2)));
              if ((float)local_820._0_4_ < 0.0) {
                local_880._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar24 << 2)));
                fVar268 = sqrtf((float)local_820._0_4_);
                auVar94 = local_880._0_16_;
              }
              auVar94 = vinsertps_avx(ZEXT416(uVar91),auVar94,0x10);
              auVar271 = ZEXT1664(auVar94);
              lVar88 = 5;
              do {
                uVar185 = auVar271._0_4_;
                auVar166._4_4_ = uVar185;
                auVar166._0_4_ = uVar185;
                auVar166._8_4_ = uVar185;
                auVar166._12_4_ = uVar185;
                auVar94 = vfmadd132ps_fma(auVar166,ZEXT816(0) << 0x40,local_810);
                local_760 = auVar271._0_32_;
                auVar100 = vmovshdup_avx(auVar271._0_16_);
                fVar241 = auVar100._0_4_;
                fVar240 = 1.0 - fVar241;
                fVar239 = fVar240 * fVar240 * fVar240;
                fVar269 = fVar241 * fVar241;
                fVar183 = fVar269 * fVar241;
                auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar239),
                                         ZEXT416((uint)fVar183));
                fVar270 = fVar241 * fVar240;
                local_880._0_16_ = ZEXT416((uint)fVar240);
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar270 * fVar241 * 6.0)),
                                           ZEXT416((uint)(fVar270 * fVar240)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar183),
                                          ZEXT416((uint)fVar239));
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar270 * fVar240 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar270 * fVar241)));
                fVar239 = fVar239 * 0.16666667;
                fVar240 = (auVar2._0_4_ + auVar101._0_4_) * 0.16666667;
                fVar241 = (auVar95._0_4_ + auVar93._0_4_) * 0.16666667;
                fVar183 = fVar183 * 0.16666667;
                auVar211._0_4_ = fVar183 * (float)local_7e0._0_4_;
                auVar211._4_4_ = fVar183 * (float)local_7e0._4_4_;
                auVar211._8_4_ = fVar183 * fStack_7d8;
                auVar211._12_4_ = fVar183 * fStack_7d4;
                auVar243._4_4_ = fVar241;
                auVar243._0_4_ = fVar241;
                auVar243._8_4_ = fVar241;
                auVar243._12_4_ = fVar241;
                auVar2 = vfmadd132ps_fma(auVar243,auVar211,local_7a0._0_16_);
                auVar212._4_4_ = fVar240;
                auVar212._0_4_ = fVar240;
                auVar212._8_4_ = fVar240;
                auVar212._12_4_ = fVar240;
                auVar2 = vfmadd132ps_fma(auVar212,auVar2,local_7c0._0_16_);
                auVar191._4_4_ = fVar239;
                auVar191._0_4_ = fVar239;
                auVar191._8_4_ = fVar239;
                auVar191._12_4_ = fVar239;
                auVar2 = vfmadd132ps_fma(auVar191,auVar2,local_780._0_16_);
                local_600._0_16_ = auVar2;
                auVar2 = vsubps_avx(auVar94,auVar2);
                auVar94 = vdpps_avx(auVar2,auVar2,0x7f);
                local_840._0_16_ = auVar94;
                if (auVar94._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar269;
                  local_8c0._0_4_ = fVar270;
                  auVar267._0_4_ = sqrtf(auVar94._0_4_);
                  auVar267._4_60_ = extraout_var_00;
                  auVar94 = auVar267._0_16_;
                  fVar270 = (float)local_8c0._0_4_;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  local_8a0._0_4_ = fVar269;
                }
                local_620._4_4_ = local_880._0_4_;
                local_620._0_4_ = local_620._4_4_;
                fStack_618 = (float)local_620._4_4_;
                fStack_614 = (float)local_620._4_4_;
                auVar101 = vfnmsub213ss_fma(auVar100,auVar100,ZEXT416((uint)(fVar270 * 4.0)));
                auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar270 * 4.0)),local_880._0_16_,
                                          local_880._0_16_);
                fVar269 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
                fVar270 = auVar101._0_4_ * 0.5;
                fVar239 = auVar95._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar230._0_4_ = (float)local_8a0._0_4_ * (float)local_7e0._0_4_;
                auVar230._4_4_ = (float)local_8a0._0_4_ * (float)local_7e0._4_4_;
                auVar230._8_4_ = (float)local_8a0._0_4_ * fStack_7d8;
                auVar230._12_4_ = (float)local_8a0._0_4_ * fStack_7d4;
                auVar192._4_4_ = fVar239;
                auVar192._0_4_ = fVar239;
                auVar192._8_4_ = fVar239;
                auVar192._12_4_ = fVar239;
                auVar95 = vfmadd132ps_fma(auVar192,auVar230,local_7a0._0_16_);
                auVar213._4_4_ = fVar270;
                auVar213._0_4_ = fVar270;
                auVar213._8_4_ = fVar270;
                auVar213._12_4_ = fVar270;
                auVar95 = vfmadd132ps_fma(auVar213,auVar95,local_7c0._0_16_);
                auVar277._4_4_ = fVar269;
                auVar277._0_4_ = fVar269;
                auVar277._8_4_ = fVar269;
                auVar277._12_4_ = fVar269;
                _local_8a0 = vfmadd132ps_fma(auVar277,auVar95,local_780._0_16_);
                local_640._0_16_ = vdpps_avx(_local_8a0,_local_8a0,0x7f);
                auVar66._12_4_ = 0;
                auVar66._0_12_ = ZEXT812(0);
                fVar269 = local_640._0_4_;
                auVar101 = vrsqrt14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar269));
                local_660._0_16_ = vrcp14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar269));
                auVar95 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
                local_680._0_4_ = auVar95._0_4_;
                local_8c0._0_4_ = auVar94._0_4_;
                if (fVar269 < -fVar269) {
                  local_860 = auVar101;
                  fVar270 = sqrtf(fVar269);
                  auVar94 = ZEXT416((uint)local_8c0._0_4_);
                  auVar95 = local_860;
                  auVar93 = _local_8a0;
                }
                else {
                  auVar95 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                  fVar270 = auVar95._0_4_;
                  auVar95 = auVar101;
                  auVar93 = _local_8a0;
                }
                fVar239 = auVar95._0_4_;
                auVar98 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(auVar101._0_4_ * 1.5 +
                                                   fVar269 * -0.5 * fVar239 * fVar239 * fVar239)));
                auVar97 = vmulps_avx512vl(auVar93,auVar98);
                auVar95 = vdpps_avx(auVar2,auVar97,0x7f);
                fVar269 = auVar94._0_4_ + 1.0;
                fVar239 = auVar95._0_4_;
                auVar167._0_4_ = fVar239 * fVar239;
                auVar167._4_4_ = auVar95._4_4_ * auVar95._4_4_;
                auVar167._8_4_ = auVar95._8_4_ * auVar95._8_4_;
                auVar167._12_4_ = auVar95._12_4_ * auVar95._12_4_;
                auVar101 = vsubps_avx(local_840._0_16_,auVar167);
                fVar240 = auVar101._0_4_;
                auVar193._4_12_ = ZEXT812(0) << 0x20;
                auVar193._0_4_ = fVar240;
                auVar96 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar193);
                auVar102 = vmulss_avx512f(auVar96,ZEXT416(0x3fc00000));
                auVar103 = vmulss_avx512f(auVar101,ZEXT416(0xbf000000));
                if (fVar240 < 0.0) {
                  local_860._0_4_ = fVar269;
                  local_6d0._0_4_ = auVar102._0_4_;
                  _local_6f0 = auVar98;
                  local_6e0 = auVar97;
                  local_6c0 = auVar96;
                  fVar240 = sqrtf(fVar240);
                  auVar103 = ZEXT416(auVar103._0_4_);
                  auVar102 = ZEXT416((uint)local_6d0._0_4_);
                  auVar94 = ZEXT416((uint)local_8c0._0_4_);
                  auVar96 = local_6c0;
                  auVar93 = _local_8a0;
                  fVar269 = (float)local_860._0_4_;
                  auVar97 = local_6e0;
                  auVar98 = _local_6f0;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar101,auVar101);
                  fVar240 = auVar101._0_4_;
                }
                auVar279 = ZEXT1664(auVar93);
                auVar274 = ZEXT1664(local_840._0_16_);
                auVar272 = ZEXT1664(auVar2);
                auVar282 = ZEXT3264(local_8e0);
                auVar283 = ZEXT3264(local_900);
                auVar284 = ZEXT3264(local_920);
                auVar285 = ZEXT3264(local_940);
                auVar286 = ZEXT3264(local_960);
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,auVar100)
                ;
                auVar99 = vfmadd213ss_fma(auVar100,SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_);
                auVar251 = local_760._0_16_;
                auVar100 = vshufps_avx(auVar251,auVar251,0x55);
                auVar214._0_4_ = auVar100._0_4_ * (float)local_7e0._0_4_;
                auVar214._4_4_ = auVar100._4_4_ * (float)local_7e0._4_4_;
                auVar214._8_4_ = auVar100._8_4_ * fStack_7d8;
                auVar214._12_4_ = auVar100._12_4_ * fStack_7d4;
                auVar231._0_4_ = auVar99._0_4_;
                auVar231._4_4_ = auVar231._0_4_;
                auVar231._8_4_ = auVar231._0_4_;
                auVar231._12_4_ = auVar231._0_4_;
                auVar100 = vfmadd132ps_fma(auVar231,auVar214,local_7a0._0_16_);
                auVar194._0_4_ = auVar101._0_4_;
                auVar194._4_4_ = auVar194._0_4_;
                auVar194._8_4_ = auVar194._0_4_;
                auVar194._12_4_ = auVar194._0_4_;
                auVar100 = vfmadd132ps_fma(auVar194,auVar100,local_7c0._0_16_);
                auVar100 = vfmadd132ps_fma(_local_620,auVar100,local_780._0_16_);
                auVar195._0_4_ = auVar100._0_4_ * (float)local_640._0_4_;
                auVar195._4_4_ = auVar100._4_4_ * (float)local_640._0_4_;
                auVar195._8_4_ = auVar100._8_4_ * (float)local_640._0_4_;
                auVar195._12_4_ = auVar100._12_4_ * (float)local_640._0_4_;
                auVar100 = vdpps_avx(auVar93,auVar100,0x7f);
                fVar241 = auVar100._0_4_;
                auVar215._0_4_ = auVar93._0_4_ * fVar241;
                auVar215._4_4_ = auVar93._4_4_ * fVar241;
                auVar215._8_4_ = auVar93._8_4_ * fVar241;
                auVar215._12_4_ = auVar93._12_4_ * fVar241;
                auVar100 = vsubps_avx(auVar195,auVar215);
                fVar241 = (float)local_680._0_4_ * (float)local_660._0_4_;
                auVar99 = vmaxss_avx(ZEXT416((uint)fVar263),
                                     ZEXT416((uint)(local_760._0_4_ * fVar268 * 1.9073486e-06)));
                auVar216._0_4_ = auVar100._0_4_ * fVar241;
                auVar216._4_4_ = auVar100._4_4_ * fVar241;
                auVar216._8_4_ = auVar100._8_4_ * fVar241;
                auVar216._12_4_ = auVar100._12_4_ * fVar241;
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar104 = vxorps_avx512vl(auVar93,auVar28);
                auVar98 = vmulps_avx512vl(auVar98,auVar216);
                auVar100 = vdpps_avx(auVar104,auVar97,0x7f);
                auVar101 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar263),auVar99);
                auVar94 = vdpps_avx(auVar2,auVar98,0x7f);
                auVar98 = vfmadd213ss_fma(ZEXT416((uint)fVar269),ZEXT416((uint)(fVar263 / fVar270)),
                                          auVar101);
                fVar269 = auVar100._0_4_ + auVar94._0_4_;
                auVar94 = vdpps_avx(local_810,auVar97,0x7f);
                auVar100 = vdpps_avx(auVar2,auVar104,0x7f);
                auVar101 = vmulss_avx512f(auVar103,auVar96);
                auVar102 = vaddss_avx512f(auVar102,ZEXT416((uint)(auVar101._0_4_ *
                                                                 auVar96._0_4_ * auVar96._0_4_)));
                auVar101 = vdpps_avx(auVar2,local_810,0x7f);
                auVar97 = vfnmadd231ss_fma(auVar100,auVar95,ZEXT416((uint)fVar269));
                auVar101 = vfnmadd231ss_fma(auVar101,auVar95,auVar94);
                auVar100 = vpermilps_avx(local_600._0_16_,0xff);
                fVar240 = fVar240 - auVar100._0_4_;
                auVar96 = vshufps_avx(auVar93,auVar93,0xff);
                auVar100 = vfmsub213ss_fma(auVar97,auVar102,auVar96);
                auVar265._8_4_ = 0x80000000;
                auVar265._0_8_ = 0x8000000080000000;
                auVar265._12_4_ = 0x80000000;
                auVar267 = ZEXT1664(auVar265);
                auVar260._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
                auVar260._8_4_ = auVar100._8_4_ ^ 0x80000000;
                auVar260._12_4_ = auVar100._12_4_ ^ 0x80000000;
                auVar262 = ZEXT1664(auVar260);
                auVar101 = ZEXT416((uint)(auVar101._0_4_ * auVar102._0_4_));
                auVar97 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar100._0_4_)),
                                          ZEXT416((uint)fVar269),auVar101);
                auVar100 = vinsertps_avx(auVar260,auVar101,0x1c);
                auVar253._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
                auVar253._8_4_ = auVar94._8_4_ ^ 0x80000000;
                auVar253._12_4_ = auVar94._12_4_ ^ 0x80000000;
                auVar101 = vinsertps_avx(ZEXT416((uint)fVar269),auVar253,0x10);
                auVar232._0_4_ = auVar97._0_4_;
                auVar232._4_4_ = auVar232._0_4_;
                auVar232._8_4_ = auVar232._0_4_;
                auVar232._12_4_ = auVar232._0_4_;
                auVar94 = vdivps_avx(auVar100,auVar232);
                auVar100 = vdivps_avx(auVar101,auVar232);
                auVar254 = ZEXT1664(CONCAT412(fVar240,CONCAT48(fVar240,CONCAT44(fVar240,fVar240))));
                auVar233._0_4_ = fVar239 * auVar94._0_4_ + fVar240 * auVar100._0_4_;
                auVar233._4_4_ = fVar239 * auVar94._4_4_ + fVar240 * auVar100._4_4_;
                auVar233._8_4_ = fVar239 * auVar94._8_4_ + fVar240 * auVar100._8_4_;
                auVar233._12_4_ = fVar239 * auVar94._12_4_ + fVar240 * auVar100._12_4_;
                auVar94 = vsubps_avx(auVar251,auVar233);
                auVar271 = ZEXT1664(auVar94);
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar100 = vandps_avx512vl(auVar95,auVar29);
                if (auVar100._0_4_ < auVar98._0_4_) {
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar98._0_4_ + auVar99._0_4_)),
                                             local_700,ZEXT416(0x36000000));
                  auVar30._8_4_ = 0x7fffffff;
                  auVar30._0_8_ = 0x7fffffff7fffffff;
                  auVar30._12_4_ = 0x7fffffff;
                  auVar95 = vandps_avx512vl(ZEXT416((uint)fVar240),auVar30);
                  if (auVar95._0_4_ < auVar100._0_4_) {
                    fVar268 = auVar94._0_4_ + (float)local_710._0_4_;
                    if ((fVar268 < fVar160) ||
                       (fVar269 = *(float *)(ray + k * 4 + 0x100), fVar269 < fVar268)) break;
                    auVar100 = vmovshdup_avx(auVar94);
                    fVar270 = auVar100._0_4_;
                    if ((fVar270 < 0.0) || (1.0 < fVar270)) break;
                    auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_840._0_4_))
                    ;
                    fVar240 = auVar100._0_4_;
                    fVar239 = local_840._0_4_ * -0.5;
                    auVar254 = ZEXT464((uint)fVar239);
                    pGVar5 = (context->scene->geometries).items[uVar81].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar239 = fVar240 * 1.5 + fVar239 * fVar240 * fVar240 * fVar240;
                    auVar234._0_4_ = auVar2._0_4_ * fVar239;
                    auVar234._4_4_ = auVar2._4_4_ * fVar239;
                    auVar234._8_4_ = auVar2._8_4_ * fVar239;
                    auVar234._12_4_ = auVar2._12_4_ * fVar239;
                    auVar96 = vfmadd213ps_fma(auVar96,auVar234,auVar93);
                    auVar100 = vshufps_avx(auVar234,auVar234,0xc9);
                    auVar95 = vshufps_avx(auVar93,auVar93,0xc9);
                    auVar235._0_4_ = auVar234._0_4_ * auVar95._0_4_;
                    auVar235._4_4_ = auVar234._4_4_ * auVar95._4_4_;
                    auVar235._8_4_ = auVar234._8_4_ * auVar95._8_4_;
                    auVar235._12_4_ = auVar234._12_4_ * auVar95._12_4_;
                    auVar101 = vfmsub231ps_fma(auVar235,auVar93,auVar100);
                    auVar100 = vshufps_avx(auVar101,auVar101,0xc9);
                    auVar95 = vshufps_avx(auVar96,auVar96,0xc9);
                    auVar254 = ZEXT1664(auVar95);
                    auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                    auVar168._0_4_ = auVar96._0_4_ * auVar101._0_4_;
                    auVar168._4_4_ = auVar96._4_4_ * auVar101._4_4_;
                    auVar168._8_4_ = auVar96._8_4_ * auVar101._8_4_;
                    auVar168._12_4_ = auVar96._12_4_ * auVar101._12_4_;
                    auVar100 = vfmsub231ps_fma(auVar168,auVar100,auVar95);
                    uVar185 = auVar100._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar268;
                      uVar4 = vextractps_avx(auVar100,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                      uVar4 = vextractps_avx(auVar100,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar185;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar270;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_848;
                      *(uint *)(ray + k * 4 + 0x240) = uVar81;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar9 = context->user;
                    auVar238._8_4_ = 1;
                    auVar238._0_8_ = 0x100000001;
                    auVar238._12_4_ = 1;
                    auVar238._16_4_ = 1;
                    auVar238._20_4_ = 1;
                    auVar238._24_4_ = 1;
                    auVar238._28_4_ = 1;
                    local_440 = vpermps_avx2(auVar238,ZEXT1632(auVar94));
                    auVar115 = vpermps_avx2(auVar238,ZEXT1632(auVar100));
                    auVar247._8_4_ = 2;
                    auVar247._0_8_ = 0x200000002;
                    auVar247._12_4_ = 2;
                    auVar247._16_4_ = 2;
                    auVar247._20_4_ = 2;
                    auVar247._24_4_ = 2;
                    auVar247._28_4_ = 2;
                    local_480 = vpermps_avx2(auVar247,ZEXT1632(auVar100));
                    local_4a0[0] = (RTCHitN)auVar115[0];
                    local_4a0[1] = (RTCHitN)auVar115[1];
                    local_4a0[2] = (RTCHitN)auVar115[2];
                    local_4a0[3] = (RTCHitN)auVar115[3];
                    local_4a0[4] = (RTCHitN)auVar115[4];
                    local_4a0[5] = (RTCHitN)auVar115[5];
                    local_4a0[6] = (RTCHitN)auVar115[6];
                    local_4a0[7] = (RTCHitN)auVar115[7];
                    local_4a0[8] = (RTCHitN)auVar115[8];
                    local_4a0[9] = (RTCHitN)auVar115[9];
                    local_4a0[10] = (RTCHitN)auVar115[10];
                    local_4a0[0xb] = (RTCHitN)auVar115[0xb];
                    local_4a0[0xc] = (RTCHitN)auVar115[0xc];
                    local_4a0[0xd] = (RTCHitN)auVar115[0xd];
                    local_4a0[0xe] = (RTCHitN)auVar115[0xe];
                    local_4a0[0xf] = (RTCHitN)auVar115[0xf];
                    local_4a0[0x10] = (RTCHitN)auVar115[0x10];
                    local_4a0[0x11] = (RTCHitN)auVar115[0x11];
                    local_4a0[0x12] = (RTCHitN)auVar115[0x12];
                    local_4a0[0x13] = (RTCHitN)auVar115[0x13];
                    local_4a0[0x14] = (RTCHitN)auVar115[0x14];
                    local_4a0[0x15] = (RTCHitN)auVar115[0x15];
                    local_4a0[0x16] = (RTCHitN)auVar115[0x16];
                    local_4a0[0x17] = (RTCHitN)auVar115[0x17];
                    local_4a0[0x18] = (RTCHitN)auVar115[0x18];
                    local_4a0[0x19] = (RTCHitN)auVar115[0x19];
                    local_4a0[0x1a] = (RTCHitN)auVar115[0x1a];
                    local_4a0[0x1b] = (RTCHitN)auVar115[0x1b];
                    local_4a0[0x1c] = (RTCHitN)auVar115[0x1c];
                    local_4a0[0x1d] = (RTCHitN)auVar115[0x1d];
                    local_4a0[0x1e] = (RTCHitN)auVar115[0x1e];
                    local_4a0[0x1f] = (RTCHitN)auVar115[0x1f];
                    local_460 = uVar185;
                    uStack_45c = uVar185;
                    uStack_458 = uVar185;
                    uStack_454 = uVar185;
                    uStack_450 = uVar185;
                    uStack_44c = uVar185;
                    uStack_448 = uVar185;
                    uStack_444 = uVar185;
                    local_420 = ZEXT432(0) << 0x20;
                    local_400 = local_4e0._0_8_;
                    uStack_3f8 = local_4e0._8_8_;
                    uStack_3f0 = local_4e0._16_8_;
                    uStack_3e8 = local_4e0._24_8_;
                    local_3e0 = local_4c0;
                    auVar115 = vpcmpeqd_avx2(local_4c0,local_4c0);
                    local_850[1] = auVar115;
                    *local_850 = auVar115;
                    local_3c0 = pRVar9->instID[0];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    local_3a0 = pRVar9->instPrimID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar268;
                    local_740 = local_520;
                    local_990.valid = (int *)local_740;
                    local_990.geometryUserPtr = pGVar5->userPtr;
                    local_990.context = context->user;
                    local_990.hit = local_4a0;
                    local_990.N = 8;
                    local_990.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar254 = ZEXT1664(auVar95);
                      auVar262 = ZEXT1664(auVar260);
                      auVar267 = ZEXT1664(auVar265);
                      auVar271 = ZEXT1664(auVar94);
                      auVar272 = ZEXT1664(auVar2);
                      auVar274 = ZEXT1664(local_840._0_16_);
                      auVar279 = ZEXT1664(auVar93);
                      (*pGVar5->intersectionFilterN)(&local_990);
                      auVar286 = ZEXT3264(local_960);
                      auVar285 = ZEXT3264(local_940);
                      auVar284 = ZEXT3264(local_920);
                      auVar283 = ZEXT3264(local_900);
                      auVar282 = ZEXT3264(local_8e0);
                    }
                    if (local_740 != (undefined1  [32])0x0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar254 = ZEXT1664(auVar254._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar272 = ZEXT1664(auVar272._0_16_);
                        auVar274 = ZEXT1664(auVar274._0_16_);
                        auVar279 = ZEXT1664(auVar279._0_16_);
                        (*p_Var10)(&local_990);
                        auVar286 = ZEXT3264(local_960);
                        auVar285 = ZEXT3264(local_940);
                        auVar284 = ZEXT3264(local_920);
                        auVar283 = ZEXT3264(local_900);
                        auVar282 = ZEXT3264(local_8e0);
                      }
                      if (local_740 != (undefined1  [32])0x0) {
                        uVar89 = vptestmd_avx512vl(local_740,local_740);
                        iVar67 = *(int *)(local_990.hit + 4);
                        iVar68 = *(int *)(local_990.hit + 8);
                        iVar69 = *(int *)(local_990.hit + 0xc);
                        iVar70 = *(int *)(local_990.hit + 0x10);
                        iVar71 = *(int *)(local_990.hit + 0x14);
                        iVar72 = *(int *)(local_990.hit + 0x18);
                        iVar73 = *(int *)(local_990.hit + 0x1c);
                        bVar87 = (byte)uVar89;
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x180) =
                             (uint)(bVar87 & 1) * *(int *)local_990.hit |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_990.ray + 0x180);
                        *(uint *)(local_990.ray + 0x184) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x184)
                        ;
                        *(uint *)(local_990.ray + 0x188) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x188)
                        ;
                        *(uint *)(local_990.ray + 0x18c) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x18c)
                        ;
                        *(uint *)(local_990.ray + 400) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 400);
                        *(uint *)(local_990.ray + 0x194) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 0x194)
                        ;
                        *(uint *)(local_990.ray + 0x198) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x198)
                        ;
                        *(uint *)(local_990.ray + 0x19c) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x19c)
                        ;
                        iVar67 = *(int *)(local_990.hit + 0x24);
                        iVar68 = *(int *)(local_990.hit + 0x28);
                        iVar69 = *(int *)(local_990.hit + 0x2c);
                        iVar70 = *(int *)(local_990.hit + 0x30);
                        iVar71 = *(int *)(local_990.hit + 0x34);
                        iVar72 = *(int *)(local_990.hit + 0x38);
                        iVar73 = *(int *)(local_990.hit + 0x3c);
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x1a0) =
                             (uint)(bVar87 & 1) * *(int *)(local_990.hit + 0x20) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_990.ray + 0x1a0);
                        *(uint *)(local_990.ray + 0x1a4) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1a4)
                        ;
                        *(uint *)(local_990.ray + 0x1a8) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1a8)
                        ;
                        *(uint *)(local_990.ray + 0x1ac) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1ac)
                        ;
                        *(uint *)(local_990.ray + 0x1b0) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 0x1b0)
                        ;
                        *(uint *)(local_990.ray + 0x1b4) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 0x1b4)
                        ;
                        *(uint *)(local_990.ray + 0x1b8) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x1b8)
                        ;
                        *(uint *)(local_990.ray + 0x1bc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x1bc)
                        ;
                        iVar67 = *(int *)(local_990.hit + 0x44);
                        iVar68 = *(int *)(local_990.hit + 0x48);
                        iVar69 = *(int *)(local_990.hit + 0x4c);
                        iVar70 = *(int *)(local_990.hit + 0x50);
                        iVar71 = *(int *)(local_990.hit + 0x54);
                        iVar72 = *(int *)(local_990.hit + 0x58);
                        iVar73 = *(int *)(local_990.hit + 0x5c);
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x1c0) =
                             (uint)(bVar87 & 1) * *(int *)(local_990.hit + 0x40) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_990.ray + 0x1c0);
                        *(uint *)(local_990.ray + 0x1c4) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1c4)
                        ;
                        *(uint *)(local_990.ray + 0x1c8) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1c8)
                        ;
                        *(uint *)(local_990.ray + 0x1cc) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1cc)
                        ;
                        *(uint *)(local_990.ray + 0x1d0) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 0x1d0)
                        ;
                        *(uint *)(local_990.ray + 0x1d4) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 0x1d4)
                        ;
                        *(uint *)(local_990.ray + 0x1d8) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x1d8)
                        ;
                        *(uint *)(local_990.ray + 0x1dc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x1dc)
                        ;
                        iVar67 = *(int *)(local_990.hit + 100);
                        iVar68 = *(int *)(local_990.hit + 0x68);
                        iVar69 = *(int *)(local_990.hit + 0x6c);
                        iVar70 = *(int *)(local_990.hit + 0x70);
                        iVar71 = *(int *)(local_990.hit + 0x74);
                        iVar72 = *(int *)(local_990.hit + 0x78);
                        iVar73 = *(int *)(local_990.hit + 0x7c);
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x1e0) =
                             (uint)(bVar87 & 1) * *(int *)(local_990.hit + 0x60) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_990.ray + 0x1e0);
                        *(uint *)(local_990.ray + 0x1e4) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1e4)
                        ;
                        *(uint *)(local_990.ray + 0x1e8) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1e8)
                        ;
                        *(uint *)(local_990.ray + 0x1ec) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1ec)
                        ;
                        *(uint *)(local_990.ray + 0x1f0) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 0x1f0)
                        ;
                        *(uint *)(local_990.ray + 500) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 500);
                        *(uint *)(local_990.ray + 0x1f8) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x1f8)
                        ;
                        *(uint *)(local_990.ray + 0x1fc) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x1fc)
                        ;
                        iVar67 = *(int *)(local_990.hit + 0x84);
                        iVar68 = *(int *)(local_990.hit + 0x88);
                        iVar69 = *(int *)(local_990.hit + 0x8c);
                        iVar70 = *(int *)(local_990.hit + 0x90);
                        iVar71 = *(int *)(local_990.hit + 0x94);
                        iVar72 = *(int *)(local_990.hit + 0x98);
                        iVar73 = *(int *)(local_990.hit + 0x9c);
                        bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar89 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
                        bVar17 = SUB81(uVar89 >> 7,0);
                        *(uint *)(local_990.ray + 0x200) =
                             (uint)(bVar87 & 1) * *(int *)(local_990.hit + 0x80) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_990.ray + 0x200);
                        *(uint *)(local_990.ray + 0x204) =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * *(int *)(local_990.ray + 0x204)
                        ;
                        *(uint *)(local_990.ray + 0x208) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_990.ray + 0x208)
                        ;
                        *(uint *)(local_990.ray + 0x20c) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_990.ray + 0x20c)
                        ;
                        *(uint *)(local_990.ray + 0x210) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_990.ray + 0x210)
                        ;
                        *(uint *)(local_990.ray + 0x214) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_990.ray + 0x214)
                        ;
                        *(uint *)(local_990.ray + 0x218) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_990.ray + 0x218)
                        ;
                        *(uint *)(local_990.ray + 0x21c) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_990.ray + 0x21c)
                        ;
                        auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xa0));
                        *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar115;
                        auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xc0));
                        *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar115;
                        auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xe0));
                        *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar115;
                        auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar115;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar269;
                    break;
                  }
                }
                lVar88 = lVar88 + -1;
              } while (lVar88 != 0);
              uVar185 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar175._4_4_ = uVar185;
              auVar175._0_4_ = uVar185;
              auVar175._8_4_ = uVar185;
              auVar175._12_4_ = uVar185;
              auVar175._16_4_ = uVar185;
              auVar175._20_4_ = uVar185;
              auVar175._24_4_ = uVar185;
              auVar175._28_4_ = uVar185;
              auVar75._4_4_ = fStack_55c;
              auVar75._0_4_ = local_560;
              auVar75._8_4_ = fStack_558;
              auVar75._12_4_ = fStack_554;
              auVar75._16_4_ = fStack_550;
              auVar75._20_4_ = fStack_54c;
              auVar75._24_4_ = fStack_548;
              auVar75._28_4_ = fStack_544;
              uVar20 = vcmpps_avx512vl(auVar175,auVar75,0xd);
              bVar83 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar83 & (byte)uVar20;
            } while (bVar83 != 0);
            auVar149 = local_580;
            fVar263 = (float)local_800._0_4_;
            fVar268 = (float)local_800._4_4_;
            fVar269 = fStack_7f8;
            fVar270 = fStack_7f4;
            fVar239 = fStack_7f0;
            fVar240 = fStack_7ec;
            fVar241 = fStack_7e8;
            fVar183 = fStack_7e4;
          }
          uVar22 = vpcmpgtd_avx512vl(auVar149,local_500);
          uVar23 = vpcmpd_avx512vl(local_500,local_320,1);
          auVar217._0_4_ = fVar263 + (float)local_200._0_4_;
          auVar217._4_4_ = fVar268 + (float)local_200._4_4_;
          auVar217._8_4_ = fVar269 + fStack_1f8;
          auVar217._12_4_ = fVar270 + fStack_1f4;
          auVar217._16_4_ = fVar239 + fStack_1f0;
          auVar217._20_4_ = fVar240 + fStack_1ec;
          auVar217._24_4_ = fVar241 + fStack_1e8;
          auVar217._28_4_ = fVar183 + fStack_1e4;
          uVar20 = vcmpps_avx512vl(auVar217,auVar175,2);
          bVar84 = bVar84 & (byte)uVar23 & (byte)uVar20;
          auVar218._0_4_ = fVar263 + local_380._0_4_;
          auVar218._4_4_ = fVar268 + local_380._4_4_;
          auVar218._8_4_ = fVar269 + local_380._8_4_;
          auVar218._12_4_ = fVar270 + local_380._12_4_;
          auVar218._16_4_ = fVar239 + local_380._16_4_;
          auVar218._20_4_ = fVar240 + local_380._20_4_;
          auVar218._24_4_ = fVar241 + local_380._24_4_;
          auVar218._28_4_ = fVar183 + local_380._28_4_;
          uVar20 = vcmpps_avx512vl(auVar218,auVar175,2);
          bVar78 = bVar78 & (byte)uVar22 & (byte)uVar20 | bVar84;
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar288 = ZEXT3264(auVar115);
          if (bVar78 != 0) {
            abStack_180[uVar82 * 0x60] = bVar78;
            auVar151._0_4_ =
                 (uint)(bVar84 & 1) * local_200._0_4_ |
                 (uint)!(bool)(bVar84 & 1) * (int)local_380._0_4_;
            bVar11 = (bool)(bVar84 >> 1 & 1);
            auVar151._4_4_ = (uint)bVar11 * local_200._4_4_ | (uint)!bVar11 * (int)local_380._4_4_;
            bVar11 = (bool)(bVar84 >> 2 & 1);
            auVar151._8_4_ = (uint)bVar11 * (int)fStack_1f8 | (uint)!bVar11 * (int)local_380._8_4_;
            bVar11 = (bool)(bVar84 >> 3 & 1);
            auVar151._12_4_ = (uint)bVar11 * (int)fStack_1f4 | (uint)!bVar11 * (int)local_380._12_4_
            ;
            bVar11 = (bool)(bVar84 >> 4 & 1);
            auVar151._16_4_ = (uint)bVar11 * (int)fStack_1f0 | (uint)!bVar11 * (int)local_380._16_4_
            ;
            bVar11 = (bool)(bVar84 >> 5 & 1);
            auVar151._20_4_ = (uint)bVar11 * (int)fStack_1ec | (uint)!bVar11 * (int)local_380._20_4_
            ;
            auVar151._24_4_ =
                 (uint)(bVar84 >> 6) * (int)fStack_1e8 |
                 (uint)!(bool)(bVar84 >> 6) * (int)local_380._24_4_;
            auVar151._28_4_ = local_380._28_4_;
            *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x60) = auVar151;
            uVar89 = vmovlps_avx(local_530);
            (&uStack_140)[uVar82 * 0xc] = uVar89;
            aiStack_138[uVar82 * 0x18] = iVar85 + 1;
            uVar82 = (ulong)((int)uVar82 + 1);
          }
        }
      }
    }
    do {
      uVar91 = (uint)uVar82;
      uVar82 = (ulong)(uVar91 - 1);
      if (uVar91 == 0) {
        uVar185 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar36._4_4_ = uVar185;
        auVar36._0_4_ = uVar185;
        auVar36._8_4_ = uVar185;
        auVar36._12_4_ = uVar185;
        auVar36._16_4_ = uVar185;
        auVar36._20_4_ = uVar185;
        auVar36._24_4_ = uVar185;
        auVar36._28_4_ = uVar185;
        uVar20 = vcmpps_avx512vl(local_300,auVar36,2);
        uVar81 = (uint)uVar20 & (uint)local_6a8 - 1 & (uint)local_6a8;
        local_6a8 = (ulong)uVar81;
        if (uVar81 == 0) {
          return;
        }
        goto LAB_01dfdbd7;
      }
      lVar88 = uVar82 * 0x60;
      auVar115 = *(undefined1 (*) [32])(auStack_160 + lVar88);
      auVar199._0_4_ = fVar263 + auVar115._0_4_;
      auVar199._4_4_ = fVar268 + auVar115._4_4_;
      auVar199._8_4_ = fVar269 + auVar115._8_4_;
      auVar199._12_4_ = fVar270 + auVar115._12_4_;
      auVar199._16_4_ = fVar239 + auVar115._16_4_;
      auVar199._20_4_ = fVar240 + auVar115._20_4_;
      auVar199._24_4_ = fVar241 + auVar115._24_4_;
      auVar199._28_4_ = fVar183 + auVar115._28_4_;
      uVar185 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar35._4_4_ = uVar185;
      auVar35._0_4_ = uVar185;
      auVar35._8_4_ = uVar185;
      auVar35._12_4_ = uVar185;
      auVar35._16_4_ = uVar185;
      auVar35._20_4_ = uVar185;
      auVar35._24_4_ = uVar185;
      auVar35._28_4_ = uVar185;
      uVar20 = vcmpps_avx512vl(auVar199,auVar35,2);
      uVar90 = (uint)uVar20 & (uint)abStack_180[lVar88];
    } while (uVar90 == 0);
    uVar89 = (&uStack_140)[uVar82 * 0xc];
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar89;
    auVar219._8_4_ = 0x7f800000;
    auVar219._0_8_ = 0x7f8000007f800000;
    auVar219._12_4_ = 0x7f800000;
    auVar219._16_4_ = 0x7f800000;
    auVar219._20_4_ = 0x7f800000;
    auVar219._24_4_ = 0x7f800000;
    auVar219._28_4_ = 0x7f800000;
    auVar116 = vblendmps_avx512vl(auVar219,auVar115);
    bVar78 = (byte)uVar90;
    auVar152._0_4_ =
         (uint)(bVar78 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar78 & 1) * (int)auVar115._0_4_;
    bVar11 = (bool)((byte)(uVar90 >> 1) & 1);
    auVar152._4_4_ = (uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * (int)auVar115._4_4_;
    bVar11 = (bool)((byte)(uVar90 >> 2) & 1);
    auVar152._8_4_ = (uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * (int)auVar115._8_4_;
    bVar11 = (bool)((byte)(uVar90 >> 3) & 1);
    auVar152._12_4_ = (uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * (int)auVar115._12_4_;
    bVar11 = (bool)((byte)(uVar90 >> 4) & 1);
    auVar152._16_4_ = (uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * (int)auVar115._16_4_;
    bVar11 = (bool)((byte)(uVar90 >> 5) & 1);
    auVar152._20_4_ = (uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * (int)auVar115._20_4_;
    bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
    auVar152._24_4_ = (uint)bVar11 * auVar116._24_4_ | (uint)!bVar11 * (int)auVar115._24_4_;
    auVar152._28_4_ =
         (uVar90 >> 7) * auVar116._28_4_ | (uint)!SUB41(uVar90 >> 7,0) * (int)auVar115._28_4_;
    auVar115 = vshufps_avx(auVar152,auVar152,0xb1);
    auVar115 = vminps_avx(auVar152,auVar115);
    auVar116 = vshufpd_avx(auVar115,auVar115,5);
    auVar115 = vminps_avx(auVar115,auVar116);
    auVar116 = vpermpd_avx2(auVar115,0x4e);
    auVar115 = vminps_avx(auVar115,auVar116);
    uVar20 = vcmpps_avx512vl(auVar152,auVar115,0);
    bVar83 = (byte)uVar20 & bVar78;
    if (bVar83 != 0) {
      uVar90 = (uint)bVar83;
    }
    uVar153 = 0;
    for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
      uVar153 = uVar153 + 1;
    }
    iVar85 = aiStack_138[uVar82 * 0x18];
    bVar78 = ~('\x01' << ((byte)uVar153 & 0x1f)) & bVar78;
    abStack_180[lVar88] = bVar78;
    if (bVar78 == 0) {
      uVar91 = uVar91 - 1;
    }
    uVar185 = (undefined4)uVar89;
    auVar177._4_4_ = uVar185;
    auVar177._0_4_ = uVar185;
    auVar177._8_4_ = uVar185;
    auVar177._12_4_ = uVar185;
    auVar177._16_4_ = uVar185;
    auVar177._20_4_ = uVar185;
    auVar177._24_4_ = uVar185;
    auVar177._28_4_ = uVar185;
    auVar94 = vmovshdup_avx(auVar196);
    auVar94 = vsubps_avx(auVar94,auVar196);
    auVar200._0_4_ = auVar94._0_4_;
    auVar200._4_4_ = auVar200._0_4_;
    auVar200._8_4_ = auVar200._0_4_;
    auVar200._12_4_ = auVar200._0_4_;
    auVar200._16_4_ = auVar200._0_4_;
    auVar200._20_4_ = auVar200._0_4_;
    auVar200._24_4_ = auVar200._0_4_;
    auVar200._28_4_ = auVar200._0_4_;
    auVar94 = vfmadd132ps_fma(auVar200,auVar177,_DAT_01faff20);
    auVar115 = ZEXT1632(auVar94);
    local_4a0[0] = (RTCHitN)auVar115[0];
    local_4a0[1] = (RTCHitN)auVar115[1];
    local_4a0[2] = (RTCHitN)auVar115[2];
    local_4a0[3] = (RTCHitN)auVar115[3];
    local_4a0[4] = (RTCHitN)auVar115[4];
    local_4a0[5] = (RTCHitN)auVar115[5];
    local_4a0[6] = (RTCHitN)auVar115[6];
    local_4a0[7] = (RTCHitN)auVar115[7];
    local_4a0[8] = (RTCHitN)auVar115[8];
    local_4a0[9] = (RTCHitN)auVar115[9];
    local_4a0[10] = (RTCHitN)auVar115[10];
    local_4a0[0xb] = (RTCHitN)auVar115[0xb];
    local_4a0[0xc] = (RTCHitN)auVar115[0xc];
    local_4a0[0xd] = (RTCHitN)auVar115[0xd];
    local_4a0[0xe] = (RTCHitN)auVar115[0xe];
    local_4a0[0xf] = (RTCHitN)auVar115[0xf];
    local_4a0[0x10] = (RTCHitN)auVar115[0x10];
    local_4a0[0x11] = (RTCHitN)auVar115[0x11];
    local_4a0[0x12] = (RTCHitN)auVar115[0x12];
    local_4a0[0x13] = (RTCHitN)auVar115[0x13];
    local_4a0[0x14] = (RTCHitN)auVar115[0x14];
    local_4a0[0x15] = (RTCHitN)auVar115[0x15];
    local_4a0[0x16] = (RTCHitN)auVar115[0x16];
    local_4a0[0x17] = (RTCHitN)auVar115[0x17];
    local_4a0[0x18] = (RTCHitN)auVar115[0x18];
    local_4a0[0x19] = (RTCHitN)auVar115[0x19];
    local_4a0[0x1a] = (RTCHitN)auVar115[0x1a];
    local_4a0[0x1b] = (RTCHitN)auVar115[0x1b];
    local_4a0[0x1c] = (RTCHitN)auVar115[0x1c];
    local_4a0[0x1d] = (RTCHitN)auVar115[0x1d];
    local_4a0[0x1e] = (RTCHitN)auVar115[0x1e];
    local_4a0[0x1f] = (RTCHitN)auVar115[0x1f];
    auVar201 = ZEXT864(*(ulong *)(local_4a0 + (ulong)uVar153 * 4));
    uVar82 = (ulong)uVar91;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }